

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void initCMakeData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  QMultiHash<char,_QLatin1String> QVar4;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar5;
  long lVar6;
  QMultiHash<char,_QLatin1String> moved;
  char local_13a9;
  QMultiHash<char,_QLatin1String> local_13a8;
  iterator local_1398;
  undefined1 local_1380 [16];
  char *local_1370;
  undefined1 local_1368;
  undefined8 local_1360;
  char *local_1358;
  undefined1 local_1350;
  undefined8 local_1348;
  char *local_1340;
  undefined1 local_1338;
  undefined8 local_1330;
  char *local_1328;
  undefined1 local_1320;
  undefined8 local_1318;
  char *local_1310;
  undefined1 local_1308;
  undefined8 local_1300;
  char *local_12f8;
  undefined1 local_12f0;
  undefined8 local_12e8;
  char *local_12e0;
  undefined1 local_12d8;
  undefined8 local_12d0;
  char *local_12c8;
  undefined1 local_12c0;
  undefined8 local_12b8;
  char *local_12b0;
  undefined1 local_12a8;
  undefined8 local_12a0;
  char *local_1298;
  undefined1 local_1290;
  undefined8 local_1288;
  char *local_1280;
  undefined1 local_1278;
  undefined8 local_1270;
  char *local_1268;
  undefined1 local_1260;
  undefined8 local_1258;
  char *local_1250;
  undefined1 local_1248;
  undefined8 local_1240;
  char *local_1238;
  undefined1 local_1230;
  undefined8 local_1228;
  char *local_1220;
  undefined1 local_1218;
  undefined8 local_1210;
  char *local_1208;
  undefined1 local_1200;
  undefined8 local_11f8;
  char *local_11f0;
  undefined1 local_11e8;
  undefined8 local_11e0;
  char *local_11d8;
  undefined1 local_11d0;
  undefined8 local_11c8;
  char *local_11c0;
  undefined1 local_11b8;
  undefined8 local_11b0;
  char *local_11a8;
  undefined1 local_11a0;
  undefined8 local_1198;
  char *local_1190;
  undefined1 local_1188;
  undefined8 local_1180;
  char *local_1178;
  undefined1 local_1170;
  undefined8 local_1168;
  char *local_1160;
  undefined1 local_1158;
  undefined8 local_1150;
  char *local_1148;
  undefined1 local_1140;
  undefined8 local_1138;
  char *local_1130;
  undefined1 local_1128;
  undefined8 local_1120;
  char *local_1118;
  undefined1 local_1110;
  undefined8 local_1108;
  char *local_1100;
  undefined1 local_10f8;
  undefined8 local_10f0;
  char *local_10e8;
  undefined1 local_10e0;
  undefined8 local_10d8;
  char *local_10d0;
  undefined1 local_10c8;
  undefined8 local_10c0;
  char *local_10b8;
  undefined1 local_10b0;
  undefined8 local_10a8;
  char *local_10a0;
  undefined1 local_1098;
  undefined8 local_1090;
  char *local_1088;
  undefined1 local_1080;
  undefined8 local_1078;
  char *local_1070;
  undefined1 local_1068;
  undefined8 local_1060;
  char *local_1058;
  undefined1 local_1050;
  undefined8 local_1048;
  char *local_1040;
  undefined1 local_1038;
  undefined8 local_1030;
  char *local_1028;
  undefined1 local_1020;
  undefined8 local_1018;
  char *local_1010;
  undefined1 local_1008;
  undefined8 local_1000;
  char *local_ff8;
  undefined1 local_ff0;
  undefined8 local_fe8;
  char *local_fe0;
  undefined1 local_fd8;
  undefined8 local_fd0;
  char *local_fc8;
  undefined1 local_fc0;
  undefined8 local_fb8;
  char *local_fb0;
  undefined1 local_fa8;
  undefined8 local_fa0;
  char *local_f98;
  undefined1 local_f90;
  undefined8 local_f88;
  char *local_f80;
  undefined1 local_f78;
  undefined8 local_f70;
  char *local_f68;
  undefined1 local_f60;
  undefined8 local_f58;
  char *local_f50;
  undefined1 local_f48;
  undefined8 local_f40;
  char *local_f38;
  undefined1 local_f30;
  undefined8 local_f28;
  char *local_f20;
  undefined1 local_f18;
  undefined8 local_f10;
  char *local_f08;
  undefined1 local_f00;
  undefined8 local_ef8;
  char *local_ef0;
  undefined1 local_ee8;
  undefined8 local_ee0;
  char *local_ed8;
  undefined1 local_ed0;
  undefined8 local_ec8;
  char *local_ec0;
  undefined1 local_eb8;
  undefined8 local_eb0;
  char *local_ea8;
  undefined1 local_ea0;
  undefined8 local_e98;
  char *local_e90;
  undefined1 local_e88;
  undefined8 local_e80;
  char *local_e78;
  undefined1 local_e70;
  undefined8 local_e68;
  char *local_e60;
  undefined1 local_e58;
  undefined8 local_e50;
  char *local_e48;
  undefined1 local_e40;
  undefined8 local_e38;
  char *local_e30;
  undefined1 local_e28;
  undefined8 local_e20;
  char *local_e18;
  undefined1 local_e10;
  undefined8 local_e08;
  char *local_e00;
  undefined1 local_df8;
  undefined8 local_df0;
  char *local_de8;
  undefined1 local_de0;
  undefined8 local_dd8;
  char *local_dd0;
  undefined1 local_dc8;
  undefined8 local_dc0;
  char *local_db8;
  undefined1 local_db0;
  undefined8 local_da8;
  char *local_da0;
  undefined1 local_d98;
  undefined8 local_d90;
  char *local_d88;
  undefined1 local_d80;
  undefined8 local_d78;
  char *local_d70;
  undefined1 local_d68;
  undefined8 local_d60;
  char *local_d58;
  undefined1 local_d50;
  undefined8 local_d48;
  char *local_d40;
  undefined1 local_d38;
  undefined8 local_d30;
  char *local_d28;
  undefined1 local_d20;
  undefined8 local_d18;
  char *local_d10;
  undefined1 local_d08;
  undefined8 local_d00;
  char *local_cf8;
  undefined1 local_cf0;
  undefined8 local_ce8;
  char *local_ce0;
  undefined1 local_cd8;
  undefined8 local_cd0;
  char *local_cc8;
  undefined1 local_cc0;
  undefined8 local_cb8;
  char *local_cb0;
  undefined1 local_ca8;
  undefined8 local_ca0;
  char *local_c98;
  undefined1 local_c90;
  undefined8 local_c88;
  char *local_c80;
  undefined1 local_c78;
  undefined8 local_c70;
  char *local_c68;
  undefined1 local_c60;
  undefined8 local_c58;
  char *local_c50;
  undefined1 local_c48;
  undefined8 local_c40;
  char *local_c38;
  undefined1 local_c30;
  undefined8 local_c28;
  char *local_c20;
  undefined1 local_c18;
  undefined8 local_c10;
  char *local_c08;
  undefined1 local_c00;
  undefined8 local_bf8;
  char *local_bf0;
  undefined1 local_be8;
  undefined8 local_be0;
  char *local_bd8;
  undefined1 local_bd0;
  undefined8 local_bc8;
  char *local_bc0;
  undefined1 local_bb8;
  undefined8 local_bb0;
  char *local_ba8;
  undefined1 local_ba0;
  undefined8 local_b98;
  char *local_b90;
  undefined1 local_b88;
  undefined8 local_b80;
  char *local_b78;
  undefined1 local_b70;
  undefined8 local_b68;
  char *local_b60;
  undefined1 local_b58;
  undefined8 local_b50;
  char *local_b48;
  undefined1 local_b40;
  undefined8 local_b38;
  char *local_b30;
  undefined1 local_b28;
  undefined8 local_b20;
  char *local_b18;
  undefined1 local_b10;
  undefined8 local_b08;
  char *local_b00;
  undefined1 local_af8;
  undefined8 local_af0;
  char *local_ae8;
  undefined1 local_ae0;
  undefined8 local_ad8;
  char *local_ad0;
  undefined1 local_ac8;
  undefined8 local_ac0;
  char *local_ab8;
  undefined1 local_ab0;
  undefined8 local_aa8;
  char *local_aa0;
  undefined1 local_a98;
  undefined8 local_a90;
  char *local_a88;
  undefined1 local_a80;
  undefined8 local_a78;
  char *local_a70;
  undefined1 local_a68;
  undefined8 local_a60;
  char *local_a58;
  undefined1 local_a50;
  undefined8 local_a48;
  char *local_a40;
  undefined1 local_a38;
  undefined8 local_a30;
  char *local_a28;
  undefined1 local_a20;
  undefined8 local_a18;
  char *local_a10;
  undefined1 local_a08;
  undefined8 local_a00;
  char *local_9f8;
  undefined1 local_9f0;
  undefined8 local_9e8;
  char *local_9e0;
  undefined1 local_9d8;
  undefined8 local_9d0;
  char *local_9c8;
  undefined1 local_9c0;
  undefined8 local_9b8;
  char *local_9b0;
  undefined1 local_9a8;
  undefined8 local_9a0;
  char *local_998;
  undefined1 local_990;
  undefined8 local_988;
  char *local_980;
  undefined1 local_978;
  undefined8 local_970;
  char *local_968;
  undefined1 local_960;
  undefined8 local_958;
  char *local_950;
  undefined1 local_948;
  undefined8 local_940;
  char *local_938;
  undefined1 local_930;
  undefined8 local_928;
  char *local_920;
  undefined1 local_918;
  undefined8 local_910;
  char *local_908;
  undefined1 local_900;
  undefined8 local_8f8;
  char *local_8f0;
  undefined1 local_8e8;
  undefined8 local_8e0;
  char *local_8d8;
  undefined1 local_8d0;
  undefined8 local_8c8;
  char *local_8c0;
  undefined1 local_8b8;
  undefined8 local_8b0;
  char *local_8a8;
  undefined1 local_8a0;
  undefined8 local_898;
  char *local_890;
  undefined1 local_888;
  undefined8 local_880;
  char *local_878;
  undefined1 local_870;
  undefined8 local_868;
  char *local_860;
  undefined1 local_858;
  undefined8 local_850;
  char *local_848;
  undefined1 local_840;
  undefined8 local_838;
  char *local_830;
  undefined1 local_828;
  undefined8 local_820;
  char *local_818;
  undefined1 local_810;
  undefined8 local_808;
  char *local_800;
  undefined1 local_7f8;
  undefined8 local_7f0;
  char *local_7e8;
  undefined1 local_7e0;
  undefined8 local_7d8;
  char *local_7d0;
  undefined1 local_7c8;
  undefined8 local_7c0;
  char *local_7b8;
  undefined1 local_7b0;
  undefined8 local_7a8;
  char *local_7a0;
  undefined1 local_798;
  undefined8 local_790;
  char *local_788;
  undefined1 local_780;
  undefined8 local_778;
  char *local_770;
  undefined1 local_768;
  undefined8 local_760;
  char *local_758;
  undefined1 local_750;
  undefined8 local_748;
  char *local_740;
  undefined1 local_738;
  undefined8 local_730;
  char *local_728;
  undefined1 local_720;
  undefined8 local_718;
  char *local_710;
  undefined1 local_708;
  undefined8 local_700;
  char *local_6f8;
  undefined1 local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined1 local_6d8;
  undefined8 local_6d0;
  char *local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  char *local_6b0;
  undefined1 local_6a8;
  undefined8 local_6a0;
  char *local_698;
  undefined1 local_690;
  undefined8 local_688;
  char *local_680;
  undefined1 local_678;
  undefined8 local_670;
  char *local_668;
  undefined1 local_660;
  undefined8 local_658;
  char *local_650;
  undefined1 local_648;
  undefined8 local_640;
  char *local_638;
  undefined1 local_630;
  undefined8 local_628;
  char *local_620;
  undefined1 local_618;
  undefined8 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  char *local_5f0;
  undefined1 local_5e8;
  undefined8 local_5e0;
  char *local_5d8;
  undefined1 local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined1 local_5b8;
  undefined8 local_5b0;
  char *local_5a8;
  undefined1 local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined1 local_588;
  undefined8 local_580;
  char *local_578;
  undefined1 local_570;
  undefined8 local_568;
  char *local_560;
  undefined1 local_558;
  undefined8 local_550;
  char *local_548;
  undefined1 local_540;
  undefined8 local_538;
  char *local_530;
  undefined1 local_528;
  undefined8 local_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_1380[0] = 0x62;
  local_1380._8_8_ = 5;
  local_1370 = "break";
  local_1368 = 99;
  local_1360 = 0x1d;
  local_1358 = "cmake_host_system_information";
  local_1350 = 99;
  local_1348 = 0x16;
  local_1340 = "cmake_minimum_required";
  local_1338 = 99;
  local_1330 = 0x15;
  local_1328 = "cmake_parse_arguments";
  local_1320 = 99;
  local_1318 = 0xc;
  local_1310 = "cmake_policy";
  local_1308 = 99;
  local_1300 = 0xe;
  local_12f8 = "configure_file";
  local_12f0 = 99;
  local_12e8 = 8;
  local_12e0 = "continue";
  local_12d8 = 0x65;
  local_12d0 = 6;
  local_12c8 = "elseif";
  local_12c0 = 0x65;
  local_12b8 = 4;
  local_12b0 = "else";
  local_12a8 = 0x65;
  local_12a0 = 10;
  local_1298 = "endforeach";
  local_1290 = 0x65;
  local_1288 = 0xb;
  local_1280 = "endfunction";
  local_1278 = 0x65;
  local_1270 = 5;
  local_1268 = "endif";
  local_1260 = 0x65;
  local_1258 = 8;
  local_1250 = "endmacro";
  local_1248 = 0x65;
  local_1240 = 8;
  local_1238 = "endwhile";
  local_1230 = 0x65;
  local_1228 = 0xf;
  local_1220 = "execute_process";
  local_1218 = 0x66;
  local_1210 = 4;
  local_1208 = "file";
  local_1200 = 0x66;
  local_11f8 = 9;
  local_11f0 = "find_file";
  local_11e8 = 0x66;
  local_11e0 = 0xc;
  local_11d8 = "find_library";
  local_11d0 = 0x66;
  local_11c8 = 0xc;
  local_11c0 = "find_package";
  local_11b8 = 0x66;
  local_11b0 = 9;
  local_11a8 = "find_path";
  local_11a0 = 0x66;
  local_1198 = 0xc;
  local_1190 = "find_program";
  local_1188 = 0x66;
  local_1180 = 7;
  local_1178 = "foreach";
  local_1170 = 0x66;
  local_1168 = 8;
  local_1160 = "function";
  local_1158 = 0x67;
  local_1150 = 0x12;
  local_1148 = "get_cmake_property";
  local_1140 = 0x67;
  local_1138 = 0x16;
  local_1130 = "get_directory_property";
  local_1128 = 0x67;
  local_1120 = 0x16;
  local_1118 = "get_filename_component";
  local_1110 = 0x67;
  local_1108 = 0xc;
  local_1100 = "get_property";
  local_10f8 = 0x69;
  local_10f0 = 2;
  local_10e8 = "if";
  local_10e0 = 0x69;
  local_10d8 = 7;
  local_10d0 = "include";
  local_10c8 = 0x69;
  local_10c0 = 0xd;
  local_10b8 = "include_guard";
  local_10b0 = 0x6c;
  local_10a8 = 4;
  local_10a0 = "list";
  local_1098 = 0x6d;
  local_1090 = 5;
  local_1088 = "macro";
  local_1080 = 0x6d;
  local_1078 = 0x10;
  local_1070 = "mark_as_advanced";
  local_1068 = 0x6d;
  local_1060 = 4;
  local_1058 = "math";
  local_1050 = 0x6d;
  local_1048 = 7;
  local_1040 = "message";
  local_1038 = 0x6f;
  local_1030 = 6;
  local_1028 = "option";
  local_1020 = 0x72;
  local_1018 = 6;
  local_1010 = "return";
  local_1008 = 0x73;
  local_1000 = 0x12;
  local_ff8 = "separate_arguments";
  local_ff0 = 0x73;
  local_fe8 = 0x18;
  local_fe0 = "set_directory_properties";
  local_fd8 = 0x73;
  local_fd0 = 3;
  local_fc8 = "set";
  local_fc0 = 0x73;
  local_fb8 = 0xc;
  local_fb0 = "set_property";
  local_fa8 = 0x73;
  local_fa0 = 9;
  local_f98 = "site_name";
  local_f90 = 0x73;
  local_f88 = 6;
  local_f80 = "string";
  local_f78 = 0x75;
  local_f70 = 5;
  local_f68 = "unset";
  local_f60 = 0x76;
  local_f58 = 0xe;
  local_f50 = "variable_watch";
  local_f48 = 0x77;
  local_f40 = 5;
  local_f38 = "while";
  local_f30 = 0x61;
  local_f28 = 0x17;
  local_f20 = "add_compile_definitions";
  local_f18 = 0x61;
  local_f10 = 0x13;
  local_f08 = "add_compile_options";
  local_f00 = 0x41;
  local_ef8 = 0x13;
  local_ef0 = "ADD_COMPILE_OPTIONS";
  local_ee8 = 0x61;
  local_ee0 = 0x12;
  local_ed8 = "add_custom_command";
  local_ed0 = 0x61;
  local_ec8 = 0x11;
  local_ec0 = "add_custom_target";
  local_eb8 = 0x61;
  local_eb0 = 0xf;
  local_ea8 = "add_definitions";
  local_ea0 = 0x61;
  local_e98 = 0x10;
  local_e90 = "add_dependencies";
  local_e88 = 0x61;
  local_e80 = 0xe;
  local_e78 = "add_executable";
  local_e70 = 0x61;
  local_e68 = 0xb;
  local_e60 = "add_library";
  local_e58 = 0x61;
  local_e50 = 0x10;
  local_e48 = "add_link_options";
  local_e40 = 0x61;
  local_e38 = 0x10;
  local_e30 = "add_subdirectory";
  local_e28 = 0x61;
  local_e20 = 8;
  local_e18 = "add_test";
  local_e10 = 0x61;
  local_e08 = 0x14;
  local_e00 = "aux_source_directory";
  local_df8 = 0x62;
  local_df0 = 0xd;
  local_de8 = "build_command";
  local_de0 = 99;
  local_dd8 = 0x16;
  local_dd0 = "create_test_sourcelist";
  local_dc8 = 100;
  local_dc0 = 0xf;
  local_db8 = "define_property";
  local_db0 = 0x65;
  local_da8 = 0xf;
  local_da0 = "enable_language";
  local_d98 = 0x65;
  local_d90 = 0xe;
  local_d88 = "enable_testing";
  local_d80 = 0x65;
  local_d78 = 6;
  local_d70 = "export";
  local_d68 = 0x66;
  local_d60 = 0xc;
  local_d58 = "fltk_wrap_ui";
  local_d50 = 0x67;
  local_d48 = 0x18;
  local_d40 = "get_source_file_property";
  local_d38 = 0x67;
  local_d30 = 0x13;
  local_d28 = "get_target_property";
  local_d20 = 0x67;
  local_d18 = 0x11;
  local_d10 = "get_test_property";
  local_d08 = 0x69;
  local_d00 = 0x13;
  local_cf8 = "include_directories";
  local_cf0 = 0x69;
  local_ce8 = 0x1a;
  local_ce0 = "include_external_msproject";
  local_cd8 = 0x69;
  local_cd0 = 0x1a;
  local_cc8 = "include_regular_expression";
  local_cc0 = 0x69;
  local_cb8 = 7;
  local_cb0 = "install";
  local_ca8 = 0x6c;
  local_ca0 = 0x10;
  local_c98 = "link_directories";
  local_c90 = 0x6c;
  local_c88 = 0xe;
  local_c80 = "link_libraries";
  local_c78 = 0x6c;
  local_c70 = 10;
  local_c68 = "load_cache";
  local_c60 = 0x70;
  local_c58 = 7;
  local_c50 = "project";
  local_c48 = 0x71;
  local_c40 = 0xb;
  local_c38 = "qt_wrap_cpp";
  local_c30 = 0x71;
  local_c28 = 10;
  local_c20 = "qt_wrap_ui";
  local_c18 = 0x72;
  local_c10 = 0x12;
  local_c08 = "remove_definitions";
  local_c00 = 0x73;
  local_bf8 = 0x1b;
  local_bf0 = "set_source_files_properties";
  local_be8 = 0x73;
  local_be0 = 0x15;
  local_bd8 = "set_target_properties";
  local_bd0 = 0x73;
  local_bc8 = 0x14;
  local_bc0 = "set_tests_properties";
  local_bb8 = 0x73;
  local_bb0 = 0xc;
  local_ba8 = "source_group";
  local_ba0 = 0x74;
  local_b98 = 0x1a;
  local_b90 = "target_compile_definitions";
  local_b88 = 0x74;
  local_b80 = 0x17;
  local_b78 = "target_compile_features";
  local_b70 = 0x74;
  local_b68 = 0x16;
  local_b60 = "target_compile_options";
  local_b58 = 0x74;
  local_b50 = 0x1a;
  local_b48 = "target_include_directories";
  local_b40 = 0x74;
  local_b38 = 0x17;
  local_b30 = "target_link_directories";
  local_b28 = 0x74;
  local_b20 = 0x15;
  local_b18 = "target_link_libraries";
  local_b10 = 0x74;
  local_b08 = 0x13;
  local_b00 = "target_link_options";
  local_af8 = 0x74;
  local_af0 = 0xe;
  local_ae8 = "target_sources";
  local_ae0 = 0x74;
  local_ad8 = 0xb;
  local_ad0 = "try_compile";
  local_ac8 = 0x74;
  local_ac0 = 7;
  local_ab8 = "try_run";
  local_ab0 = 99;
  local_aa8 = 0xb;
  local_aa0 = "ctest_build";
  local_a98 = 99;
  local_a90 = 0xf;
  local_a88 = "ctest_configure";
  local_a80 = 99;
  local_a78 = 0xe;
  local_a70 = "ctest_coverage";
  local_a68 = 99;
  local_a60 = 0x1c;
  local_a58 = "ctest_empty_binary_directory";
  local_a50 = 99;
  local_a48 = 0xe;
  local_a40 = "ctest_memcheck";
  local_a38 = 99;
  local_a30 = 0x17;
  local_a28 = "ctest_read_custom_files";
  local_a20 = 99;
  local_a18 = 0x10;
  local_a10 = "ctest_run_script";
  local_a08 = 99;
  local_a00 = 0xb;
  local_9f8 = "ctest_sleep";
  local_9f0 = 99;
  local_9e8 = 0xb;
  local_9e0 = "ctest_start";
  local_9d8 = 99;
  local_9d0 = 0xc;
  local_9c8 = "ctest_submit";
  local_9c0 = 99;
  local_9b8 = 10;
  local_9b0 = "ctest_test";
  local_9a8 = 99;
  local_9a0 = 0xc;
  local_998 = "ctest_update";
  local_990 = 99;
  local_988 = 0xc;
  local_980 = "ctest_upload";
  local_978 = 0x62;
  local_970 = 10;
  local_968 = "build_name";
  local_960 = 0x65;
  local_958 = 0xc;
  local_950 = "exec_program";
  local_948 = 0x65;
  local_940 = 0x1b;
  local_938 = "export_library_dependencies";
  local_930 = 0x69;
  local_928 = 0xd;
  local_920 = "install_files";
  local_918 = 0x69;
  local_910 = 0x10;
  local_908 = "install_programs";
  local_900 = 0x69;
  local_8f8 = 0xf;
  local_8f0 = "install_targets";
  local_8e8 = 0x6c;
  local_8e0 = 0xc;
  local_8d8 = "load_command";
  local_8d0 = 0x6d;
  local_8c8 = 0xe;
  local_8c0 = "make_directory";
  local_8b8 = 0x6f;
  local_8b0 = 0x15;
  local_8a8 = "output_required_files";
  local_8a0 = 0x72;
  local_898 = 6;
  local_890 = "remove";
  local_888 = 0x73;
  local_880 = 0xe;
  local_878 = "subdir_depends";
  local_870 = 0x73;
  local_868 = 7;
  local_860 = "subdirs";
  local_858 = 0x75;
  local_850 = 0x10;
  local_848 = "use_mangled_mesa";
  local_840 = 0x75;
  local_838 = 0xe;
  local_830 = "utility_source";
  local_828 = 0x76;
  local_820 = 0x11;
  local_818 = "variable_requires";
  local_810 = 0x77;
  local_808 = 10;
  local_800 = "write_file";
  local_7f8 = 0x71;
  local_7f0 = 0xf;
  local_7e8 = "qt5_use_modules";
  local_7e0 = 0x71;
  local_7d8 = 0xf;
  local_7d0 = "qt5_use_package";
  local_7c8 = 0x71;
  local_7c0 = 0xc;
  local_7b8 = "qt5_wrap_cpp";
  local_7b0 = 0x61;
  local_7a8 = 3;
  local_7a0 = "and";
  local_798 = 0x6f;
  local_790 = 2;
  local_788 = "or";
  local_780 = 0x6e;
  local_778 = 3;
  local_770 = "not";
  local_768 = 99;
  local_760 = 7;
  local_758 = "command";
  local_750 = 0x70;
  local_748 = 6;
  local_740 = "policy";
  local_738 = 0x74;
  local_730 = 6;
  local_728 = "target";
  local_720 = 0x74;
  local_718 = 4;
  local_710 = "test";
  local_708 = 0x65;
  local_700 = 6;
  local_6f8 = "exists";
  local_6f0 = 0x69;
  local_6e8 = 0xd;
  local_6e0 = "is_newer_than";
  local_6d8 = 0x69;
  local_6d0 = 0xc;
  local_6c8 = "is_directory";
  local_6c0 = 0x69;
  local_6b8 = 10;
  local_6b0 = "is_symlink";
  local_6a8 = 0x69;
  local_6a0 = 0xb;
  local_698 = "is_absolute";
  local_690 = 0x6d;
  local_688 = 7;
  local_680 = "matches";
  local_678 = 0x6c;
  local_670 = 4;
  local_668 = "less";
  local_660 = 0x67;
  local_658 = 7;
  local_650 = "greater";
  local_648 = 0x65;
  local_640 = 5;
  local_638 = "equal";
  local_630 = 0x6c;
  local_628 = 10;
  local_620 = "less_equal";
  local_618 = 0x67;
  local_610 = 0xd;
  local_608 = "greater_equal";
  local_600 = 0x73;
  local_5f8 = 7;
  local_5f0 = "strless";
  local_5e8 = 0x73;
  local_5e0 = 10;
  local_5d8 = "strgreater";
  local_5d0 = 0x73;
  local_5c8 = 8;
  local_5c0 = "strequal";
  local_5b8 = 0x73;
  local_5b0 = 0xd;
  local_5a8 = "strless_equal";
  local_5a0 = 0x73;
  local_598 = 0x10;
  local_590 = "strgreater_equal";
  local_588 = 0x76;
  local_580 = 0xc;
  local_578 = "version_less";
  local_570 = 0x76;
  local_568 = 0xf;
  local_560 = "version_greater";
  local_558 = 0x76;
  local_550 = 0xd;
  local_548 = "version_equal";
  local_540 = 0x76;
  local_538 = 0x12;
  local_530 = "version_less_equal";
  local_528 = 0x76;
  local_520 = 0x15;
  local_518 = "version_greater_equal";
  local_510 = 0x69;
  local_508 = 7;
  local_500 = "in_list";
  local_4f8 = 100;
  local_4f0 = 7;
  local_4e8 = "defined";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x9c);
  local_13a8.m_size = 0;
  lVar6 = 0;
  local_13a8.d = pDVar5;
  do {
    local_13a9 = local_1380[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_1398,&local_13a8,&local_13a9,(QLatin1String *)(local_1380 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0xea0);
  QVar1.m_size = local_13a8.m_size;
  QVar1.d = local_13a8.d;
  local_13a8.d = (Data *)0x0;
  local_13a8.m_size = 0;
  local_1398.i.d = cmake_keywords.d;
  local_1398.i.bucket = cmake_keywords.m_size;
  cmake_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_13a8);
  local_1398.i = (piter)ZEXT816(0);
  local_1380._8_8_ = cmake_types.m_size;
  local_1380._0_8_ = cmake_types.d;
  cmake_types.d = (Data *)0x0;
  cmake_types.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_1380);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1398);
  local_1380[0] = 0x6f;
  local_1380._8_8_ = 2;
  local_1370 = "on";
  local_1368 = 0x6f;
  local_1360 = 3;
  local_1358 = "off";
  local_1350 = 0x4f;
  local_1348 = 2;
  local_1340 = "ON";
  local_1338 = 0x4f;
  local_1330 = 3;
  local_1328 = "OFF";
  local_1320 = 0x74;
  local_1318 = 4;
  local_1310 = "true";
  local_1308 = 0x66;
  local_1300 = 5;
  local_12f8 = "false";
  local_12f0 = 0x54;
  local_12e8 = 4;
  local_12e0 = "TRUE";
  local_12d8 = 0x46;
  local_12d0 = 5;
  local_12c8 = "FALSE";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,8);
  local_13a8.m_size = 0;
  lVar6 = 0;
  local_13a8.d = pDVar5;
  do {
    local_13a9 = local_1380[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_1398,&local_13a8,&local_13a9,(QLatin1String *)(local_1380 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0xc0);
  QVar2.m_size = local_13a8.m_size;
  QVar2.d = local_13a8.d;
  local_13a8.d = (Data *)0x0;
  local_13a8.m_size = 0;
  local_1398.i.d = cmake_literals.d;
  local_1398.i.bucket = cmake_literals.m_size;
  cmake_literals = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_13a8);
  local_1380[0] = 0x41;
  local_1380._8_8_ = 0x1e;
  local_1370 = "ALLOW_DUPLICATE_CUSTOM_TARGETS";
  local_1368 = 0x41;
  local_1360 = 0x16;
  local_1358 = "AUTOGEN_TARGETS_FOLDER";
  local_1350 = 0x41;
  local_1348 = 0x16;
  local_1340 = "AUTOMOC_TARGETS_FOLDER";
  local_1338 = 0x44;
  local_1330 = 0x14;
  local_1328 = "DEBUG_CONFIGURATIONS";
  local_1320 = 0x44;
  local_1318 = 0x11;
  local_1310 = "DISABLED_FEATURES";
  local_1308 = 0x45;
  local_1300 = 0x10;
  local_12f8 = "ENABLED_FEATURES";
  local_12f0 = 0x45;
  local_12e8 = 0x11;
  local_12e0 = "ENABLED_LANGUAGES";
  local_12d8 = 0x46;
  local_12d0 = 0x1c;
  local_12c8 = "FIND_LIBRARY_USE_LIB64_PATHS";
  local_12c0 = 0x46;
  local_12b8 = 0x23;
  local_12b0 = "FIND_LIBRARY_USE_OPENBSD_VERSIONING";
  local_12a8 = 0x47;
  local_12a0 = 0x19;
  local_1298 = "GLOBAL_DEPENDS_DEBUG_MODE";
  local_1290 = 0x47;
  local_1288 = 0x18;
  local_1280 = "GLOBAL_DEPENDS_NO_CYCLES";
  local_1278 = 0x49;
  local_1270 = 0xe;
  local_1268 = "IN_TRY_COMPILE";
  local_1260 = 0x50;
  local_1258 = 0xe;
  local_1250 = "PACKAGES_FOUND";
  local_1248 = 0x50;
  local_1240 = 0x12;
  local_1238 = "PACKAGES_NOT_FOUND";
  local_1230 = 0x4a;
  local_1228 = 9;
  local_1220 = "JOB_POOLS";
  local_1218 = 0x50;
  local_1210 = 0x19;
  local_1208 = "PREDEFINED_TARGETS_FOLDER";
  local_1200 = 0x45;
  local_11f8 = 0x15;
  local_11f0 = "ECLIPSE_EXTRA_NATURES";
  local_11e8 = 0x52;
  local_11e0 = 0x1b;
  local_11d8 = "REPORT_UNDEFINED_PROPERTIES";
  local_11d0 = 0x52;
  local_11c8 = 0x13;
  local_11c0 = "RULE_LAUNCH_COMPILE";
  local_11b8 = 0x52;
  local_11b0 = 0x12;
  local_11a8 = "RULE_LAUNCH_CUSTOM";
  local_11a0 = 0x52;
  local_1198 = 0x10;
  local_1190 = "RULE_LAUNCH_LINK";
  local_1188 = 0x52;
  local_1180 = 0xd;
  local_1178 = "RULE_MESSAGES";
  local_1170 = 0x54;
  local_1168 = 0x22;
  local_1160 = "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS";
  local_1158 = 0x54;
  local_1150 = 0x1b;
  local_1148 = "TARGET_SUPPORTS_SHARED_LIBS";
  local_1140 = 0x55;
  local_1138 = 0xb;
  local_1130 = "USE_FOLDERS";
  local_1128 = 0x41;
  local_1120 = 0x1b;
  local_1118 = "ADDITIONAL_MAKE_CLEAN_FILES";
  local_1110 = 0x43;
  local_1108 = 0xf;
  local_1100 = "CACHE_VARIABLES";
  local_10f8 = 0x43;
  local_10f0 = 0xf;
  local_10e8 = "CLEAN_NO_CUSTOM";
  local_10e0 = 0x43;
  local_10d8 = 0x17;
  local_10d0 = "CMAKE_CONFIGURE_DEPENDS";
  local_10c8 = 0x43;
  local_10c0 = 0x13;
  local_10b8 = "COMPILE_DEFINITIONS";
  local_10b0 = 0x43;
  local_10a8 = 0xf;
  local_10a0 = "COMPILE_OPTIONS";
  local_1098 = 0x44;
  local_1090 = 0xb;
  local_1088 = "DEFINITIONS";
  local_1080 = 0x45;
  local_1078 = 0x10;
  local_1070 = "EXCLUDE_FROM_ALL";
  local_1068 = 0x49;
  local_1060 = 0x22;
  local_1058 = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  local_1050 = 0x49;
  local_1048 = 0x13;
  local_1040 = "INCLUDE_DIRECTORIES";
  local_1038 = 0x49;
  local_1030 = 0x1a;
  local_1028 = "INCLUDE_REGULAR_EXPRESSION";
  local_1020 = 0x49;
  local_1018 = 0x1c;
  local_1010 = "INTERPROCEDURAL_OPTIMIZATION";
  local_1008 = 0x4c;
  local_1000 = 0x10;
  local_ff8 = "LINK_DIRECTORIES";
  local_ff0 = 0x4c;
  local_fe8 = 0xe;
  local_fe0 = "LISTFILE_STACK";
  local_fd8 = 0x4d;
  local_fd0 = 6;
  local_fc8 = "MACROS";
  local_fc0 = 0x50;
  local_fb8 = 0x10;
  local_fb0 = "PARENT_DIRECTORY";
  local_fa8 = 0x52;
  local_fa0 = 0x13;
  local_f98 = "RULE_LAUNCH_COMPILE";
  local_f90 = 0x52;
  local_f88 = 0x12;
  local_f80 = "RULE_LAUNCH_CUSTOM";
  local_f78 = 0x52;
  local_f70 = 0x10;
  local_f68 = "RULE_LAUNCH_LINK";
  local_f60 = 0x54;
  local_f58 = 0x11;
  local_f50 = "TEST_INCLUDE_FILE";
  local_f48 = 0x56;
  local_f40 = 9;
  local_f38 = "VARIABLES";
  local_f30 = 0x41;
  local_f28 = 0xe;
  local_f20 = "ALIASED_TARGET";
  local_f18 = 0x41;
  local_f10 = 0x18;
  local_f08 = "ARCHIVE_OUTPUT_DIRECTORY";
  local_f00 = 0x41;
  local_ef8 = 0x13;
  local_ef0 = "ARCHIVE_OUTPUT_NAME";
  local_ee8 = 0x41;
  local_ee0 = 0x16;
  local_ed8 = "AUTOGEN_TARGET_DEPENDS";
  local_ed0 = 0x41;
  local_ec8 = 0x13;
  local_ec0 = "AUTOMOC_MOC_OPTIONS";
  local_eb8 = 0x41;
  local_eb0 = 7;
  local_ea8 = "AUTOMOC";
  local_ea0 = 0x41;
  local_e98 = 7;
  local_e90 = "AUTOUIC";
  local_e88 = 0x41;
  local_e80 = 0xf;
  local_e78 = "AUTOUIC_OPTIONS";
  local_e70 = 0x41;
  local_e68 = 7;
  local_e60 = "AUTORCC";
  local_e58 = 0x41;
  local_e50 = 0xf;
  local_e48 = "AUTORCC_OPTIONS";
  local_e40 = 0x42;
  local_e38 = 0x18;
  local_e30 = "BUILD_WITH_INSTALL_RPATH";
  local_e28 = 0x42;
  local_e20 = 0x10;
  local_e18 = "BUNDLE_EXTENSION";
  local_e10 = 0x42;
  local_e08 = 6;
  local_e00 = "BUNDLE";
  local_df8 = 0x43;
  local_df0 = 0x19;
  local_de8 = "COMPATIBLE_INTERFACE_BOOL";
  local_de0 = 0x43;
  local_dd8 = 0x1f;
  local_dd0 = "COMPATIBLE_INTERFACE_NUMBER_MAX";
  local_dc8 = 0x43;
  local_dc0 = 0x1f;
  local_db8 = "COMPATIBLE_INTERFACE_NUMBER_MIN";
  local_db0 = 0x43;
  local_da8 = 0x1b;
  local_da0 = "COMPATIBLE_INTERFACE_STRING";
  local_d98 = 0x43;
  local_d90 = 0x13;
  local_d88 = "COMPILE_DEFINITIONS";
  local_d80 = 0x43;
  local_d78 = 0xd;
  local_d70 = "COMPILE_FLAGS";
  local_d68 = 0x43;
  local_d60 = 0xf;
  local_d58 = "COMPILE_OPTIONS";
  local_d50 = 0x44;
  local_d48 = 0xd;
  local_d40 = "DEBUG_POSTFIX";
  local_d38 = 0x44;
  local_d30 = 0xd;
  local_d28 = "DEFINE_SYMBOL";
  local_d20 = 0x45;
  local_d18 = 10;
  local_d10 = "EchoString";
  local_d08 = 0x45;
  local_d00 = 0xe;
  local_cf8 = "ENABLE_EXPORTS";
  local_cf0 = 0x45;
  local_ce8 = 0x10;
  local_ce0 = "EXCLUDE_FROM_ALL";
  local_cd8 = 0x45;
  local_cd0 = 0x1a;
  local_cc8 = "EXCLUDE_FROM_DEFAULT_BUILD";
  local_cc0 = 0x45;
  local_cb8 = 0xb;
  local_cb0 = "EXPORT_NAME";
  local_ca8 = 0x46;
  local_ca0 = 6;
  local_c98 = "FOLDER";
  local_c90 = 0x46;
  local_c88 = 0xe;
  local_c80 = "Fortran_FORMAT";
  local_c78 = 0x46;
  local_c70 = 0x18;
  local_c68 = "Fortran_MODULE_DIRECTORY";
  local_c60 = 0x46;
  local_c58 = 9;
  local_c50 = "FRAMEWORK";
  local_c48 = 0x47;
  local_c40 = 0x13;
  local_c38 = "GENERATOR_FILE_NAME";
  local_c30 = 0x47;
  local_c28 = 7;
  local_c20 = "GNUtoMS";
  local_c18 = 0x48;
  local_c10 = 7;
  local_c08 = "HAS_CXX";
  local_c00 = 0x49;
  local_bf8 = 0x22;
  local_bf0 = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  local_be8 = 0x49;
  local_be0 = 0x17;
  local_bd8 = "IMPORTED_CONFIGURATIONS";
  local_bd0 = 0x49;
  local_bc8 = 0xf;
  local_bc0 = "IMPORTED_IMPLIB";
  local_bb8 = 0x49;
  local_bb0 = 0x21;
  local_ba8 = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
  local_ba0 = 0x49;
  local_b98 = 0x21;
  local_b90 = "IMPORTED_LINK_INTERFACE_LANGUAGES";
  local_b88 = 0x49;
  local_b80 = 0x21;
  local_b78 = "IMPORTED_LINK_INTERFACE_LIBRARIES";
  local_b70 = 0x49;
  local_b68 = 0x24;
  local_b60 = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
  local_b58 = 0x49;
  local_b50 = 0x11;
  local_b48 = "IMPORTED_LOCATION";
  local_b40 = 0x49;
  local_b38 = 0x12;
  local_b30 = "IMPORTED_NO_SONAME";
  local_b28 = 0x49;
  local_b20 = 8;
  local_b18 = "IMPORTED";
  local_b10 = 0x49;
  local_b08 = 0xf;
  local_b00 = "IMPORTED_SONAME";
  local_af8 = 0x49;
  local_af0 = 0xd;
  local_ae8 = "IMPORT_PREFIX";
  local_ae0 = 0x49;
  local_ad8 = 0xd;
  local_ad0 = "IMPORT_SUFFIX";
  local_ac8 = 0x49;
  local_ac0 = 0x13;
  local_ab8 = "INCLUDE_DIRECTORIES";
  local_ab0 = 0x49;
  local_aa8 = 0x10;
  local_aa0 = "INSTALL_NAME_DIR";
  local_a98 = 0x49;
  local_a90 = 0xd;
  local_a88 = "INSTALL_RPATH";
  local_a80 = 0x49;
  local_a78 = 0x1b;
  local_a70 = "INSTALL_RPATH_USE_LINK_PATH";
  local_a68 = 0x49;
  local_a60 = 0x19;
  local_a58 = "INTERFACE_AUTOUIC_OPTIONS";
  local_a50 = 0x49;
  local_a48 = 0x1d;
  local_a40 = "INTERFACE_COMPILE_DEFINITIONS";
  local_a38 = 0x49;
  local_a30 = 0x19;
  local_a28 = "INTERFACE_COMPILE_OPTIONS";
  local_a20 = 0x49;
  local_a18 = 0x1d;
  local_a10 = "INTERFACE_INCLUDE_DIRECTORIES";
  local_a08 = 0x49;
  local_a00 = 0x18;
  local_9f8 = "INTERFACE_LINK_LIBRARIES";
  local_9f0 = 0x49;
  local_9e8 = 0x23;
  local_9e0 = "INTERFACE_POSITION_INDEPENDENT_CODE";
  local_9d8 = 0x49;
  local_9d0 = 0x24;
  local_9c8 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
  local_9c0 = 0x49;
  local_9b8 = 0x1c;
  local_9b0 = "INTERPROCEDURAL_OPTIMIZATION";
  local_9a8 = 0x4a;
  local_9a0 = 0x10;
  local_998 = "JOB_POOL_COMPILE";
  local_990 = 0x4a;
  local_988 = 0xd;
  local_980 = "JOB_POOL_LINK";
  local_978 = 0x4c;
  local_970 = 6;
  local_968 = "LABELS";
  local_960 = 0x4c;
  local_958 = 0x18;
  local_950 = "LIBRARY_OUTPUT_DIRECTORY";
  local_948 = 0x4c;
  local_940 = 0x13;
  local_938 = "LIBRARY_OUTPUT_NAME";
  local_930 = 0x4c;
  local_928 = 0x16;
  local_920 = "LINK_DEPENDS_NO_SHARED";
  local_918 = 0x4c;
  local_910 = 0xc;
  local_908 = "LINK_DEPENDS";
  local_900 = 0x4c;
  local_8f8 = 0xf;
  local_8f0 = "LINKER_LANGUAGE";
  local_8e8 = 0x4c;
  local_8e0 = 10;
  local_8d8 = "LINK_FLAGS";
  local_8d0 = 0x4c;
  local_8c8 = 0x18;
  local_8c0 = "LINK_INTERFACE_LIBRARIES";
  local_8b8 = 0x4c;
  local_8b0 = 0x1b;
  local_8a8 = "LINK_INTERFACE_MULTIPLICITY";
  local_8a0 = 0x4c;
  local_898 = 0xe;
  local_890 = "LINK_LIBRARIES";
  local_888 = 0x4c;
  local_880 = 0x16;
  local_878 = "LINK_SEARCH_END_STATIC";
  local_870 = 0x4c;
  local_868 = 0x18;
  local_860 = "LINK_SEARCH_START_STATIC";
  local_858 = 0x4c;
  local_850 = 8;
  local_848 = "LOCATION";
  local_840 = 0x4d;
  local_838 = 0x18;
  local_830 = "MACOSX_BUNDLE_INFO_PLIST";
  local_828 = 0x4d;
  local_820 = 0xd;
  local_818 = "MACOSX_BUNDLE";
  local_810 = 0x4d;
  local_808 = 0x1b;
  local_800 = "MACOSX_FRAMEWORK_INFO_PLIST";
  local_7f8 = 0x4d;
  local_7f0 = 0xc;
  local_7e8 = "MACOSX_RPATH";
  local_7e0 = 0x4e;
  local_7d8 = 9;
  local_7d0 = "NO_SONAME";
  local_7c8 = 0x4e;
  local_7c0 = 0x17;
  local_7b8 = "NO_SYSTEM_FROM_IMPORTED";
  local_7b0 = 0x4f;
  local_7a8 = 0x11;
  local_7a0 = "OSX_ARCHITECTURES";
  local_798 = 0x4f;
  local_790 = 0xb;
  local_788 = "OUTPUT_NAME";
  local_780 = 0x50;
  local_778 = 8;
  local_770 = "PDB_NAME";
  local_768 = 0x50;
  local_760 = 0x14;
  local_758 = "PDB_OUTPUT_DIRECTORY";
  local_750 = 0x50;
  local_748 = 0x19;
  local_740 = "POSITION_INDEPENDENT_CODE";
  local_738 = 0x50;
  local_730 = 0x13;
  local_728 = "POST_INSTALL_SCRIPT";
  local_720 = 0x50;
  local_718 = 6;
  local_710 = "PREFIX";
  local_708 = 0x50;
  local_700 = 8;
  local_6f8 = "PROPERTY";
  local_6f0 = 0x50;
  local_6e8 = 0x12;
  local_6e0 = "PRE_INSTALL_SCRIPT";
  local_6d8 = 0x50;
  local_6d0 = 0xe;
  local_6c8 = "PRIVATE_HEADER";
  local_6c0 = 0x50;
  local_6b8 = 0xd;
  local_6b0 = "PROJECT_LABEL";
  local_6a8 = 0x50;
  local_6a0 = 0xd;
  local_698 = "PUBLIC_HEADER";
  local_690 = 0x52;
  local_688 = 8;
  local_680 = "RESOURCE";
  local_678 = 0x52;
  local_670 = 0x13;
  local_668 = "RULE_LAUNCH_COMPILE";
  local_660 = 0x52;
  local_658 = 0x12;
  local_650 = "RULE_LAUNCH_CUSTOM";
  local_648 = 0x52;
  local_640 = 0x10;
  local_638 = "RULE_LAUNCH_LINK";
  local_630 = 0x52;
  local_628 = 0x18;
  local_620 = "RUNTIME_OUTPUT_DIRECTORY";
  local_618 = 0x52;
  local_610 = 0x13;
  local_608 = "RUNTIME_OUTPUT_NAME";
  local_600 = 0x53;
  local_5f8 = 0x10;
  local_5f0 = "SKIP_BUILD_RPATH";
  local_5e8 = 0x53;
  local_5e0 = 7;
  local_5d8 = "SOURCES";
  local_5d0 = 0x53;
  local_5c8 = 9;
  local_5c0 = "SOVERSION";
  local_5b8 = 0x53;
  local_5b0 = 0x14;
  local_5a8 = "STATIC_LIBRARY_FLAGS";
  local_5a0 = 0x53;
  local_598 = 6;
  local_590 = "SUFFIX";
  local_588 = 0x54;
  local_580 = 6;
  local_578 = "TARGET";
  local_570 = 0x54;
  local_568 = 4;
  local_560 = "TYPE";
  local_558 = 0x56;
  local_550 = 7;
  local_548 = "VERSION";
  local_540 = 0x56;
  local_538 = 0x19;
  local_530 = "VISIBILITY_INLINES_HIDDEN";
  local_528 = 0x56;
  local_520 = 0x14;
  local_518 = "VS_DOTNET_REFERENCES";
  local_510 = 0x56;
  local_508 = 0x22;
  local_500 = "VS_DOTNET_TARGET_FRAMEWORK_VERSION";
  local_4f8 = 0x56;
  local_4f0 = 0x11;
  local_4e8 = "VS_GLOBAL_KEYWORD";
  local_4e0 = 0x56;
  local_4d8 = 0x17;
  local_4d0 = "VS_GLOBAL_PROJECT_TYPES";
  local_4c8 = 0x56;
  local_4c0 = 0x17;
  local_4b8 = "VS_GLOBAL_ROOTNAMESPACE";
  local_4b0 = 0x56;
  local_4a8 = 10;
  local_4a0 = "VS_KEYWORD";
  local_498 = 0x56;
  local_490 = 0xe;
  local_488 = "VS_SCC_AUXPATH";
  local_480 = 0x56;
  local_478 = 0x10;
  local_470 = "VS_SCC_LOCALPATH";
  local_468 = 0x56;
  local_460 = 0x12;
  local_458 = "VS_SCC_PROJECTNAME";
  local_450 = 0x56;
  local_448 = 0xf;
  local_440 = "VS_SCC_PROVIDER";
  local_438 = 0x56;
  local_430 = 0x13;
  local_428 = "VS_WINRT_EXTENSIONS";
  local_420 = 0x56;
  local_418 = 0x13;
  local_410 = "VS_WINRT_REFERENCES";
  local_408 = 0x57;
  local_400 = 0x10;
  local_3f8 = "WIN32_EXECUTABLE";
  local_3f0 = 0x41;
  local_3e8 = 0x16;
  local_3e0 = "ATTACHED_FILES_ON_FAIL";
  local_3d8 = 0x41;
  local_3d0 = 0xe;
  local_3c8 = "ATTACHED_FILES";
  local_3c0 = 0x43;
  local_3b8 = 4;
  local_3b0 = "COST";
  local_3a8 = 0x44;
  local_3a0 = 7;
  local_398 = "DEPENDS";
  local_390 = 0x45;
  local_388 = 0xb;
  local_380 = "ENVIRONMENT";
  local_378 = 0x46;
  local_370 = 0x17;
  local_368 = "FAIL_REGULAR_EXPRESSION";
  local_360 = 0x4c;
  local_358 = 6;
  local_350 = "LABELS";
  local_348 = 0x4d;
  local_340 = 0xb;
  local_338 = "MEASUREMENT";
  local_330 = 0x50;
  local_328 = 0x17;
  local_320 = "PASS_REGULAR_EXPRESSION";
  local_318 = 0x50;
  local_310 = 10;
  local_308 = "PROCESSORS";
  local_300 = 0x52;
  local_2f8 = 0xe;
  local_2f0 = "REQUIRED_FILES";
  local_2e8 = 0x52;
  local_2e0 = 0xd;
  local_2d8 = "RESOURCE_LOCK";
  local_2d0 = 0x52;
  local_2c8 = 10;
  local_2c0 = "RUN_SERIAL";
  local_2b8 = 0x53;
  local_2b0 = 0x10;
  local_2a8 = "SKIP_RETURN_CODE";
  local_2a0 = 0x54;
  local_298 = 7;
  local_290 = "TIMEOUT";
  local_288 = 0x57;
  local_280 = 9;
  local_278 = "WILL_FAIL";
  local_270 = 0x57;
  local_268 = 0x11;
  local_260 = "WORKING_DIRECTORY";
  local_258 = 0x41;
  local_250 = 8;
  local_248 = "ABSTRACT";
  local_240 = 0x41;
  local_238 = 0xf;
  local_230 = "AUTOUIC_OPTIONS";
  local_228 = 0x41;
  local_220 = 0xf;
  local_218 = "AUTORCC_OPTIONS";
  local_210 = 0x43;
  local_208 = 0x13;
  local_200 = "COMPILE_DEFINITIONS";
  local_1f8 = 0x43;
  local_1f0 = 0xd;
  local_1e8 = "COMPILE_FLAGS";
  local_1e0 = 0x45;
  local_1d8 = 0xf;
  local_1d0 = "EXTERNAL_OBJECT";
  local_1c8 = 0x46;
  local_1c0 = 0xe;
  local_1b8 = "Fortran_FORMAT";
  local_1b0 = 0x47;
  local_1a8 = 9;
  local_1a0 = "GENERATED";
  local_198 = 0x48;
  local_190 = 0x10;
  local_188 = "HEADER_FILE_ONLY";
  local_180 = 0x4b;
  local_178 = 0xe;
  local_170 = "KEEP_EXTENSION";
  local_168 = 0x4c;
  local_160 = 6;
  local_158 = "LABELS";
  local_150 = 0x4c;
  local_148 = 8;
  local_140 = "LOCATION";
  local_138 = 0x4d;
  local_130 = 0x17;
  local_128 = "MACOSX_PACKAGE_LOCATION";
  local_120 = 0x4f;
  local_118 = 0xe;
  local_110 = "OBJECT_DEPENDS";
  local_108 = 0x4f;
  local_100 = 0xe;
  local_f8 = "OBJECT_OUTPUTS";
  local_f0 = 0x53;
  local_e8 = 8;
  local_e0 = "SYMBOLIC";
  local_d8 = 0x57;
  local_d0 = 0xc;
  local_c8 = "WRAP_EXCLUDE";
  local_c0 = 0x41;
  local_b8 = 8;
  local_b0 = "ADVANCED";
  local_a8 = 0x48;
  local_a0 = 10;
  local_98 = "HELPSTRING";
  local_90 = 0x4d;
  local_88 = 8;
  local_80 = "MODIFIED";
  local_78 = 0x53;
  local_70 = 7;
  local_68 = "STRINGS";
  local_60 = 0x54;
  local_58 = 4;
  local_50 = "TYPE";
  local_48 = 0x56;
  local_40 = 5;
  local_38 = "VALUE";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0xce);
  local_13a8.m_size = 0;
  lVar6 = 0;
  local_13a8.d = pDVar5;
  do {
    local_13a9 = local_1380[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_1398,&local_13a8,&local_13a9,(QLatin1String *)(local_1380 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x1350);
  QVar3.m_size = local_13a8.m_size;
  QVar3.d = local_13a8.d;
  local_13a8.d = (Data *)0x0;
  local_13a8.m_size = 0;
  local_1398.i.d = cmake_builtin.d;
  local_1398.i.bucket = cmake_builtin.m_size;
  cmake_builtin = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_13a8);
  local_1380[0] = 0x43;
  local_1380._8_8_ = 10;
  local_1370 = "CMAKE_ARGC";
  local_1368 = 0x43;
  local_1360 = 0xb;
  local_1358 = "CMAKE_ARGV0";
  local_1350 = 0x43;
  local_1348 = 8;
  local_1340 = "CMAKE_AR";
  local_1338 = 0x43;
  local_1330 = 0x10;
  local_1328 = "CMAKE_BINARY_DIR";
  local_1320 = 0x43;
  local_1318 = 0x10;
  local_1310 = "CMAKE_BUILD_TOOL";
  local_1308 = 0x43;
  local_1300 = 0x13;
  local_12f8 = "CMAKE_CACHEFILE_DIR";
  local_12f0 = 0x43;
  local_12e8 = 0x19;
  local_12e0 = "CMAKE_CACHE_MAJOR_VERSION";
  local_12d8 = 0x43;
  local_12d0 = 0x19;
  local_12c8 = "CMAKE_CACHE_MINOR_VERSION";
  local_12c0 = 0x43;
  local_12b8 = 0x19;
  local_12b0 = "CMAKE_CACHE_PATCH_VERSION";
  local_12a8 = 0x43;
  local_12a0 = 0x10;
  local_1298 = "CMAKE_CFG_INTDIR";
  local_1290 = 0x43;
  local_1288 = 0xd;
  local_1280 = "CMAKE_COMMAND";
  local_1278 = 0x43;
  local_1270 = 0x14;
  local_1268 = "CMAKE_CROSSCOMPILING";
  local_1260 = 0x43;
  local_1258 = 0x13;
  local_1250 = "CMAKE_CTEST_COMMAND";
  local_1248 = 0x43;
  local_1240 = 0x18;
  local_1238 = "CMAKE_CURRENT_BINARY_DIR";
  local_1230 = 0x43;
  local_1228 = 0x16;
  local_1220 = "CMAKE_CURRENT_LIST_DIR";
  local_1218 = 0x43;
  local_1210 = 0x17;
  local_1208 = "CMAKE_CURRENT_LIST_FILE";
  local_1200 = 0x43;
  local_11f8 = 0x17;
  local_11f0 = "CMAKE_CURRENT_LIST_LINE";
  local_11e8 = 0x43;
  local_11e0 = 0x18;
  local_11d8 = "CMAKE_CURRENT_SOURCE_DIR";
  local_11d0 = 0x43;
  local_11c8 = 0xd;
  local_11c0 = "CMAKE_DL_LIBS";
  local_11b8 = 0x43;
  local_11b0 = 0x12;
  local_11a8 = "CMAKE_EDIT_COMMAND";
  local_11a0 = 0x43;
  local_1198 = 0x17;
  local_1190 = "CMAKE_EXECUTABLE_SUFFIX";
  local_1188 = 0x43;
  local_1180 = 0x15;
  local_1178 = "CMAKE_EXTRA_GENERATOR";
  local_1170 = 0x43;
  local_1168 = 0x23;
  local_1160 = "CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES";
  local_1158 = 0x43;
  local_1150 = 0xf;
  local_1148 = "CMAKE_GENERATOR";
  local_1140 = 0x43;
  local_1138 = 0x17;
  local_1130 = "CMAKE_GENERATOR_TOOLSET";
  local_1128 = 0x43;
  local_1120 = 0x14;
  local_1118 = "CMAKE_HOME_DIRECTORY";
  local_1110 = 0x43;
  local_1108 = 0x1b;
  local_1100 = "CMAKE_IMPORT_LIBRARY_PREFIX";
  local_10f8 = 0x43;
  local_10f0 = 0x1b;
  local_10e8 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
  local_10e0 = 0x43;
  local_10d8 = 0x16;
  local_10d0 = "CMAKE_JOB_POOL_COMPILE";
  local_10c8 = 0x43;
  local_10c0 = 0x13;
  local_10b8 = "CMAKE_JOB_POOL_LINK";
  local_10b0 = 0x43;
  local_10a8 = 0x19;
  local_10a0 = "CMAKE_LINK_LIBRARY_SUFFIX";
  local_1098 = 0x43;
  local_1090 = 0x13;
  local_1088 = "CMAKE_MAJOR_VERSION";
  local_1080 = 0x43;
  local_1078 = 0x12;
  local_1070 = "CMAKE_MAKE_PROGRAM";
  local_1068 = 0x43;
  local_1060 = 0x1e;
  local_1058 = "CMAKE_MINIMUM_REQUIRED_VERSION";
  local_1050 = 0x43;
  local_1048 = 0x13;
  local_1040 = "CMAKE_MINOR_VERSION";
  local_1038 = 0x43;
  local_1030 = 0x16;
  local_1028 = "CMAKE_PARENT_LIST_FILE";
  local_1020 = 0x43;
  local_1018 = 0x13;
  local_1010 = "CMAKE_PATCH_VERSION";
  local_1008 = 0x43;
  local_1000 = 0x12;
  local_ff8 = "CMAKE_PROJECT_NAME";
  local_ff0 = 0x43;
  local_fe8 = 0xc;
  local_fe0 = "CMAKE_RANLIB";
  local_fd8 = 0x43;
  local_fd0 = 10;
  local_fc8 = "CMAKE_ROOT";
  local_fc0 = 0x43;
  local_fb8 = 0x16;
  local_fb0 = "CMAKE_SCRIPT_MODE_FILE";
  local_fa8 = 0x43;
  local_fa0 = 0x1b;
  local_f98 = "CMAKE_SHARED_LIBRARY_PREFIX";
  local_f90 = 0x43;
  local_f88 = 0x1b;
  local_f80 = "CMAKE_SHARED_LIBRARY_SUFFIX";
  local_f78 = 0x43;
  local_f70 = 0x1a;
  local_f68 = "CMAKE_SHARED_MODULE_PREFIX";
  local_f60 = 0x43;
  local_f58 = 0x1a;
  local_f50 = "CMAKE_SHARED_MODULE_SUFFIX";
  local_f48 = 0x43;
  local_f40 = 0x13;
  local_f38 = "CMAKE_SIZEOF_VOID_P";
  local_f30 = 0x43;
  local_f28 = 0x18;
  local_f20 = "CMAKE_SKIP_INSTALL_RULES";
  local_f18 = 0x43;
  local_f10 = 0x10;
  local_f08 = "CMAKE_SKIP_RPATH";
  local_f00 = 0x43;
  local_ef8 = 0x10;
  local_ef0 = "CMAKE_SOURCE_DIR";
  local_ee8 = 0x43;
  local_ee0 = 0x18;
  local_ed8 = "CMAKE_STANDARD_LIBRARIES";
  local_ed0 = 0x43;
  local_ec8 = 0x1b;
  local_ec0 = "CMAKE_STATIC_LIBRARY_PREFIX";
  local_eb8 = 0x43;
  local_eb0 = 0x1b;
  local_ea8 = "CMAKE_STATIC_LIBRARY_SUFFIX";
  local_ea0 = 0x43;
  local_e98 = 0x14;
  local_e90 = "CMAKE_TOOLCHAIN_FILE";
  local_e88 = 0x43;
  local_e80 = 0x13;
  local_e78 = "CMAKE_TWEAK_VERSION";
  local_e70 = 0x43;
  local_e68 = 0x16;
  local_e60 = "CMAKE_VERBOSE_MAKEFILE";
  local_e58 = 0x43;
  local_e50 = 0xd;
  local_e48 = "CMAKE_VERSION";
  local_e40 = 0x43;
  local_e38 = 0x17;
  local_e30 = "CMAKE_VS_DEVENV_COMMAND";
  local_e28 = 0x43;
  local_e20 = 0x26;
  local_e18 = "CMAKE_VS_INTEL_Fortran_PROJECT_VERSION";
  local_e10 = 0x43;
  local_e08 = 0x18;
  local_e00 = "CMAKE_VS_MSBUILD_COMMAND";
  local_df8 = 0x43;
  local_df0 = 0x16;
  local_de8 = "CMAKE_VS_MSDEV_COMMAND";
  local_de0 = 0x43;
  local_dd8 = 0x19;
  local_dd0 = "CMAKE_VS_PLATFORM_TOOLSET";
  local_dc8 = 0x43;
  local_dc0 = 0x1c;
  local_db8 = "CMAKE_XCODE_PLATFORM_TOOLSET";
  local_db0 = 0x50;
  local_da8 = 0x12;
  local_da0 = "PROJECT_BINARY_DIR";
  local_d98 = 0x50;
  local_d90 = 0x12;
  local_d88 = "PROJECT_SOURCE_DIR";
  local_d80 = 0x50;
  local_d78 = 0xf;
  local_d70 = "PROJECT_VERSION";
  local_d68 = 0x50;
  local_d60 = 0x15;
  local_d58 = "PROJECT_VERSION_MAJOR";
  local_d50 = 0x50;
  local_d48 = 0x15;
  local_d40 = "PROJECT_VERSION_MINOR";
  local_d38 = 0x50;
  local_d30 = 0x15;
  local_d28 = "PROJECT_VERSION_PATCH";
  local_d20 = 0x50;
  local_d18 = 0x15;
  local_d10 = "PROJECT_VERSION_TWEAK";
  local_d08 = 0x42;
  local_d00 = 0x11;
  local_cf8 = "BUILD_SHARED_LIBS";
  local_cf0 = 0x43;
  local_ce8 = 0x20;
  local_ce0 = "CMAKE_ABSOLUTE_DESTINATION_FILES";
  local_cd8 = 0x43;
  local_cd0 = 0x14;
  local_cc8 = "CMAKE_APPBUNDLE_PATH";
  local_cc0 = 0x43;
  local_cb8 = 0x1a;
  local_cb0 = "CMAKE_AUTOMOC_RELAXED_MODE";
  local_ca8 = 0x43;
  local_ca0 = 0x1d;
  local_c98 = "CMAKE_BACKWARDS_COMPATIBILITY";
  local_c90 = 0x43;
  local_c88 = 0x10;
  local_c80 = "CMAKE_BUILD_TYPE";
  local_c78 = 0x43;
  local_c70 = 0x14;
  local_c68 = "CMAKE_COLOR_MAKEFILE";
  local_c60 = 0x43;
  local_c58 = 0x19;
  local_c50 = "CMAKE_CONFIGURATION_TYPES";
  local_c48 = 0x43;
  local_c40 = 0x1d;
  local_c38 = "CMAKE_DEBUG_TARGET_PROPERTIES";
  local_c30 = 0x43;
  local_c28 = 0x16;
  local_c20 = "CMAKE_ERROR_DEPRECATED";
  local_c18 = 0x43;
  local_c10 = 0x2b;
  local_c08 = "CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION";
  local_c00 = 0x43;
  local_bf8 = 0xd;
  local_bf0 = "CMAKE_SYSROOT";
  local_be8 = 0x43;
  local_be0 = 0x1b;
  local_bd8 = "CMAKE_FIND_LIBRARY_PREFIXES";
  local_bd0 = 0x43;
  local_bc8 = 0x1b;
  local_bc0 = "CMAKE_FIND_LIBRARY_SUFFIXES";
  local_bb8 = 0x43;
  local_bb0 = 0x1c;
  local_ba8 = "CMAKE_FIND_NO_INSTALL_PREFIX";
  local_ba0 = 0x43;
  local_b98 = 0x21;
  local_b90 = "CMAKE_FIND_PACKAGE_WARN_NO_MODULE";
  local_b88 = 0x43;
  local_b80 = 0x14;
  local_b78 = "CMAKE_FIND_ROOT_PATH";
  local_b70 = 0x43;
  local_b68 = 0x21;
  local_b60 = "CMAKE_FIND_ROOT_PATH_MODE_INCLUDE";
  local_b58 = 0x43;
  local_b50 = 0x21;
  local_b48 = "CMAKE_FIND_ROOT_PATH_MODE_LIBRARY";
  local_b40 = 0x43;
  local_b38 = 0x21;
  local_b30 = "CMAKE_FIND_ROOT_PATH_MODE_PACKAGE";
  local_b28 = 0x43;
  local_b20 = 0x21;
  local_b18 = "CMAKE_FIND_ROOT_PATH_MODE_PROGRAM";
  local_b10 = 0x43;
  local_b08 = 0x14;
  local_b00 = "CMAKE_FRAMEWORK_PATH";
  local_af8 = 0x43;
  local_af0 = 0x11;
  local_ae8 = "CMAKE_IGNORE_PATH";
  local_ae0 = 0x43;
  local_ad8 = 0x12;
  local_ad0 = "CMAKE_INCLUDE_PATH";
  local_ac8 = 0x43;
  local_ac0 = 0x20;
  local_ab8 = "CMAKE_INCLUDE_DIRECTORIES_BEFORE";
  local_ab0 = 0x43;
  local_aa8 = 0x28;
  local_aa0 = "CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE";
  local_a98 = 0x43;
  local_a90 = 0x24;
  local_a88 = "CMAKE_INSTALL_DEFAULT_COMPONENT_NAME";
  local_a80 = 0x43;
  local_a78 = 0x14;
  local_a70 = "CMAKE_INSTALL_PREFIX";
  local_a68 = 0x43;
  local_a60 = 0x12;
  local_a58 = "CMAKE_LIBRARY_PATH";
  local_a50 = 0x43;
  local_a48 = 0xe;
  local_a40 = "CMAKE_MFC_FLAG";
  local_a38 = 0x43;
  local_a30 = 0x11;
  local_a28 = "CMAKE_MODULE_PATH";
  local_a20 = 0x43;
  local_a18 = 0x1c;
  local_a10 = "CMAKE_NOT_USING_CONFIG_FLAGS";
  local_a08 = 0x43;
  local_a00 = 0x11;
  local_9f8 = "CMAKE_PREFIX_PATH";
  local_9f0 = 0x43;
  local_9e8 = 0x12;
  local_9e0 = "CMAKE_PROGRAM_PATH";
  local_9d8 = 0x43;
  local_9d0 = 0x21;
  local_9c8 = "CMAKE_SKIP_INSTALL_ALL_DEPENDENCY";
  local_9c0 = 0x43;
  local_9b8 = 0x14;
  local_9b0 = "CMAKE_STAGING_PREFIX";
  local_9a8 = 0x43;
  local_9a0 = 0x18;
  local_998 = "CMAKE_SYSTEM_IGNORE_PATH";
  local_990 = 0x43;
  local_988 = 0x19;
  local_980 = "CMAKE_SYSTEM_INCLUDE_PATH";
  local_978 = 0x43;
  local_970 = 0x19;
  local_968 = "CMAKE_SYSTEM_LIBRARY_PATH";
  local_960 = 0x43;
  local_958 = 0x18;
  local_950 = "CMAKE_SYSTEM_PREFIX_PATH";
  local_948 = 0x43;
  local_940 = 0x19;
  local_938 = "CMAKE_SYSTEM_PROGRAM_PATH";
  local_930 = 0x43;
  local_928 = 0x1e;
  local_920 = "CMAKE_USER_MAKE_RULES_OVERRIDE";
  local_918 = 0x43;
  local_910 = 0x15;
  local_908 = "CMAKE_WARN_DEPRECATED";
  local_900 = 0x43;
  local_8f8 = 0x2a;
  local_8f0 = "CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION";
  local_8e8 = 0x41;
  local_8e0 = 5;
  local_8d8 = "APPLE";
  local_8d0 = 0x42;
  local_8c8 = 7;
  local_8c0 = "BORLAND";
  local_8b8 = 0x43;
  local_8b0 = 0xb;
  local_8a8 = "CMAKE_CL_64";
  local_8a0 = 0x43;
  local_898 = 0x13;
  local_890 = "CMAKE_COMPILER_2005";
  local_888 = 0x43;
  local_880 = 0x10;
  local_878 = "CMAKE_HOST_APPLE";
  local_870 = 0x43;
  local_868 = 0x16;
  local_860 = "CMAKE_HOST_SYSTEM_NAME";
  local_858 = 0x43;
  local_850 = 0x1b;
  local_848 = "CMAKE_HOST_SYSTEM_PROCESSOR";
  local_840 = 0x43;
  local_838 = 0x11;
  local_830 = "CMAKE_HOST_SYSTEM";
  local_828 = 0x43;
  local_820 = 0x19;
  local_818 = "CMAKE_HOST_SYSTEM_VERSION";
  local_810 = 0x43;
  local_808 = 0xf;
  local_800 = "CMAKE_HOST_UNIX";
  local_7f8 = 0x43;
  local_7f0 = 0x10;
  local_7e8 = "CMAKE_HOST_WIN32";
  local_7e0 = 0x43;
  local_7d8 = 0x20;
  local_7d0 = "CMAKE_LIBRARY_ARCHITECTURE_REGEX";
  local_7c8 = 0x43;
  local_7c0 = 0x1a;
  local_7b8 = "CMAKE_LIBRARY_ARCHITECTURE";
  local_7b0 = 0x43;
  local_7a8 = 0x15;
  local_7a0 = "CMAKE_OBJECT_PATH_MAX";
  local_798 = 0x43;
  local_790 = 0x11;
  local_788 = "CMAKE_SYSTEM_NAME";
  local_780 = 0x43;
  local_778 = 0x16;
  local_770 = "CMAKE_SYSTEM_PROCESSOR";
  local_768 = 0x43;
  local_760 = 0xc;
  local_758 = "CMAKE_SYSTEM";
  local_750 = 0x43;
  local_748 = 0x14;
  local_740 = "CMAKE_SYSTEM_VERSION";
  local_738 = 0x43;
  local_730 = 6;
  local_728 = "CYGWIN";
  local_720 = 0x45;
  local_718 = 3;
  local_710 = "ENV";
  local_708 = 0x4d;
  local_700 = 6;
  local_6f8 = "MSVC10";
  local_6f0 = 0x4d;
  local_6e8 = 6;
  local_6e0 = "MSVC11";
  local_6d8 = 0x4d;
  local_6d0 = 6;
  local_6c8 = "MSVC12";
  local_6c0 = 0x4d;
  local_6b8 = 6;
  local_6b0 = "MSVC60";
  local_6a8 = 0x4d;
  local_6a0 = 6;
  local_698 = "MSVC70";
  local_690 = 0x4d;
  local_688 = 6;
  local_680 = "MSVC71";
  local_678 = 0x4d;
  local_670 = 6;
  local_668 = "MSVC80";
  local_660 = 0x4d;
  local_658 = 6;
  local_650 = "MSVC90";
  local_648 = 0x4d;
  local_640 = 8;
  local_638 = "MSVC_IDE";
  local_630 = 0x4d;
  local_628 = 4;
  local_620 = "MSVC";
  local_618 = 0x4d;
  local_610 = 0xc;
  local_608 = "MSVC_VERSION";
  local_600 = 0x55;
  local_5f8 = 4;
  local_5f0 = "UNIX";
  local_5e8 = 0x57;
  local_5e0 = 5;
  local_5d8 = "WIN32";
  local_5d0 = 0x58;
  local_5c8 = 0xd;
  local_5c0 = "XCODE_VERSION";
  local_5b8 = 0x43;
  local_5b0 = 0x1e;
  local_5a8 = "CMAKE_ARCHIVE_OUTPUT_DIRECTORY";
  local_5a0 = 0x43;
  local_598 = 0x19;
  local_590 = "CMAKE_AUTOMOC_MOC_OPTIONS";
  local_588 = 0x43;
  local_580 = 0xd;
  local_578 = "CMAKE_AUTOMOC";
  local_570 = 0x43;
  local_568 = 0xd;
  local_560 = "CMAKE_AUTORCC";
  local_558 = 0x43;
  local_550 = 0x15;
  local_548 = "CMAKE_AUTORCC_OPTIONS";
  local_540 = 0x43;
  local_538 = 0xd;
  local_530 = "CMAKE_AUTOUIC";
  local_528 = 0x43;
  local_520 = 0x15;
  local_518 = "CMAKE_AUTOUIC_OPTIONS";
  local_510 = 0x43;
  local_508 = 0x1e;
  local_500 = "CMAKE_BUILD_WITH_INSTALL_RPATH";
  local_4f8 = 0x43;
  local_4f0 = 0x13;
  local_4e8 = "CMAKE_DEBUG_POSTFIX";
  local_4e0 = 0x43;
  local_4d8 = 0x16;
  local_4d0 = "CMAKE_EXE_LINKER_FLAGS";
  local_4c8 = 0x43;
  local_4c0 = 0x14;
  local_4b8 = "CMAKE_Fortran_FORMAT";
  local_4b0 = 0x43;
  local_4a8 = 0x1e;
  local_4a0 = "CMAKE_Fortran_MODULE_DIRECTORY";
  local_498 = 0x43;
  local_490 = 0xd;
  local_488 = "CMAKE_GNUtoMS";
  local_480 = 0x43;
  local_478 = 0x26;
  local_470 = "CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE";
  local_468 = 0x43;
  local_460 = 0x19;
  local_458 = "CMAKE_INCLUDE_CURRENT_DIR";
  local_450 = 0x43;
  local_448 = 0x16;
  local_440 = "CMAKE_INSTALL_NAME_DIR";
  local_438 = 0x43;
  local_430 = 0x13;
  local_428 = "CMAKE_INSTALL_RPATH";
  local_420 = 0x43;
  local_418 = 0x21;
  local_410 = "CMAKE_INSTALL_RPATH_USE_LINK_PATH";
  local_408 = 0x43;
  local_400 = 0x1e;
  local_3f8 = "CMAKE_LIBRARY_OUTPUT_DIRECTORY";
  local_3f0 = 0x43;
  local_3e8 = 0x17;
  local_3e0 = "CMAKE_LIBRARY_PATH_FLAG";
  local_3d8 = 0x43;
  local_3d0 = 0x18;
  local_3c8 = "CMAKE_LINK_DEF_FILE_FLAG";
  local_3c0 = 0x43;
  local_3b8 = 0x1c;
  local_3b0 = "CMAKE_LINK_DEPENDS_NO_SHARED";
  local_3a8 = 0x43;
  local_3a0 = 0x1e;
  local_398 = "CMAKE_LINK_INTERFACE_LIBRARIES";
  local_390 = 0x43;
  local_388 = 0x1c;
  local_380 = "CMAKE_LINK_LIBRARY_FILE_FLAG";
  local_378 = 0x43;
  local_370 = 0x17;
  local_368 = "CMAKE_LINK_LIBRARY_FLAG";
  local_360 = 0x43;
  local_358 = 0x13;
  local_350 = "CMAKE_MACOSX_BUNDLE";
  local_348 = 0x43;
  local_340 = 0x12;
  local_338 = "CMAKE_MACOSX_RPATH";
  local_330 = 0x43;
  local_328 = 0x19;
  local_320 = "CMAKE_MODULE_LINKER_FLAGS";
  local_318 = 0x43;
  local_310 = 0x18;
  local_308 = "CMAKE_NO_BUILTIN_CHRPATH";
  local_300 = 0x43;
  local_2f8 = 0x1d;
  local_2f0 = "CMAKE_NO_SYSTEM_FROM_IMPORTED";
  local_2e8 = 0x43;
  local_2e0 = 0x17;
  local_2d8 = "CMAKE_OSX_ARCHITECTURES";
  local_2d0 = 0x43;
  local_2c8 = 0x1b;
  local_2c0 = "CMAKE_OSX_DEPLOYMENT_TARGET";
  local_2b8 = 0x43;
  local_2b0 = 0x11;
  local_2a8 = "CMAKE_OSX_SYSROOT";
  local_2a0 = 0x43;
  local_298 = 0x1a;
  local_290 = "CMAKE_PDB_OUTPUT_DIRECTORY";
  local_288 = 0x43;
  local_280 = 0x1f;
  local_278 = "CMAKE_POSITION_INDEPENDENT_CODE";
  local_270 = 0x43;
  local_268 = 0x1e;
  local_260 = "CMAKE_RUNTIME_OUTPUT_DIRECTORY";
  local_258 = 0x43;
  local_250 = 0x19;
  local_248 = "CMAKE_SHARED_LINKER_FLAGS";
  local_240 = 0x43;
  local_238 = 0x16;
  local_230 = "CMAKE_SKIP_BUILD_RPATH";
  local_228 = 0x43;
  local_220 = 0x18;
  local_218 = "CMAKE_SKIP_INSTALL_RPATH";
  local_210 = 0x43;
  local_208 = 0x19;
  local_200 = "CMAKE_STATIC_LINKER_FLAGS";
  local_1f8 = 0x43;
  local_1f0 = 0x1f;
  local_1e8 = "CMAKE_TRY_COMPILE_CONFIGURATION";
  local_1e0 = 0x43;
  local_1d8 = 0x18;
  local_1d0 = "CMAKE_USE_RELATIVE_PATHS";
  local_1c8 = 0x43;
  local_1c0 = 0x1f;
  local_1b8 = "CMAKE_VISIBILITY_INLINES_HIDDEN";
  local_1b0 = 0x43;
  local_1a8 = 0x16;
  local_1a0 = "CMAKE_WIN32_EXECUTABLE";
  local_198 = 0x45;
  local_190 = 0x16;
  local_188 = "EXECUTABLE_OUTPUT_PATH";
  local_180 = 0x4c;
  local_178 = 0x13;
  local_170 = "LIBRARY_OUTPUT_PATH";
  local_168 = 0x43;
  local_160 = 0x1c;
  local_158 = "CMAKE_Fortran_MODDIR_DEFAULT";
  local_150 = 0x43;
  local_148 = 0x19;
  local_140 = "CMAKE_Fortran_MODDIR_FLAG";
  local_138 = 0x43;
  local_130 = 0x19;
  local_128 = "CMAKE_Fortran_MODOUT_FLAG";
  local_120 = 0x43;
  local_118 = 0x1b;
  local_110 = "CMAKE_INTERNAL_PLATFORM_ABI";
  local_108 = 0x43;
  local_100 = 0x20;
  local_f8 = "CPACK_ABSOLUTE_DESTINATION_FILES";
  local_f0 = 0x43;
  local_e8 = 0x2a;
  local_e0 = "CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY";
  local_d8 = 0x43;
  local_d0 = 0x2b;
  local_c8 = "CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION";
  local_c0 = 0x43;
  local_b8 = 0x20;
  local_b0 = "CPACK_INCLUDE_TOPLEVEL_DIRECTORY";
  local_a8 = 0x43;
  local_a0 = 0x14;
  local_98 = "CPACK_INSTALL_SCRIPT";
  local_90 = 0x43;
  local_88 = 0x1e;
  local_80 = "CPACK_PACKAGING_INSTALL_PREFIX";
  local_78 = 0x43;
  local_70 = 0x11;
  local_68 = "CPACK_SET_DESTDIR";
  local_60 = 0x43;
  local_58 = 0x2a;
  local_50 = "CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0xcd);
  local_13a8.m_size = 0;
  lVar6 = 0;
  local_13a8.d = pDVar5;
  do {
    local_13a9 = local_1380[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_1398,&local_13a8,&local_13a9,(QLatin1String *)(local_1380 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x1338);
  QVar4.m_size = local_13a8.m_size;
  QVar4.d = local_13a8.d;
  local_13a8.d = (Data *)0x0;
  local_13a8.m_size = 0;
  local_1398.i.d = cmake_other.d;
  local_1398.i.bucket = cmake_other.m_size;
  cmake_other = QVar4;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_13a8);
  return;
}

Assistant:

void initCMakeData() {
    cmake_keywords = {{'b', QLatin1String("break")},
                      {'c', QLatin1String("cmake_host_system_information")},
                      {'c', QLatin1String("cmake_minimum_required")},
                      {'c', QLatin1String("cmake_parse_arguments")},
                      {'c', QLatin1String("cmake_policy")},
                      {'c', QLatin1String("configure_file")},
                      {'c', QLatin1String("continue")},
                      {'e', QLatin1String("elseif")},
                      {'e', QLatin1String("else")},
                      {'e', QLatin1String("endforeach")},
                      {'e', QLatin1String("endfunction")},
                      {'e', QLatin1String("endif")},
                      {'e', QLatin1String("endmacro")},
                      {'e', QLatin1String("endwhile")},
                      {'e', QLatin1String("execute_process")},
                      {'f', QLatin1String("file")},
                      {'f', QLatin1String("find_file")},
                      {'f', QLatin1String("find_library")},
                      {'f', QLatin1String("find_package")},
                      {'f', QLatin1String("find_path")},
                      {'f', QLatin1String("find_program")},
                      {'f', QLatin1String("foreach")},
                      {'f', QLatin1String("function")},
                      {'g', QLatin1String("get_cmake_property")},
                      {'g', QLatin1String("get_directory_property")},
                      {'g', QLatin1String("get_filename_component")},
                      {'g', QLatin1String("get_property")},
                      {'i', QLatin1String("if")},
                      {'i', QLatin1String("include")},
                      {'i', QLatin1String("include_guard")},
                      {'l', QLatin1String("list")},
                      {'m', QLatin1String("macro")},
                      {'m', QLatin1String("mark_as_advanced")},
                      {'m', QLatin1String("math")},
                      {'m', QLatin1String("message")},
                      {'o', QLatin1String("option")},
                      {'r', QLatin1String("return")},
                      {'s', QLatin1String("separate_arguments")},
                      {'s', QLatin1String("set_directory_properties")},
                      {'s', QLatin1String("set")},
                      {'s', QLatin1String("set_property")},
                      {'s', QLatin1String("site_name")},
                      {'s', QLatin1String("string")},
                      {'u', QLatin1String("unset")},
                      {'v', QLatin1String("variable_watch")},
                      {'w', QLatin1String("while")},
                      {'a', QLatin1String("add_compile_definitions")},
                      {'a', QLatin1String("add_compile_options")},
                      {'A', QLatin1String("ADD_COMPILE_OPTIONS")},
                      {'a', QLatin1String("add_custom_command")},
                      {'a', QLatin1String("add_custom_target")},
                      {'a', QLatin1String("add_definitions")},
                      {'a', QLatin1String("add_dependencies")},
                      {'a', QLatin1String("add_executable")},
                      {'a', QLatin1String("add_library")},
                      {'a', QLatin1String("add_link_options")},
                      {'a', QLatin1String("add_subdirectory")},
                      {'a', QLatin1String("add_test")},
                      {'a', QLatin1String("aux_source_directory")},
                      {'b', QLatin1String("build_command")},
                      {'c', QLatin1String("create_test_sourcelist")},
                      {'d', QLatin1String("define_property")},
                      {'e', QLatin1String("enable_language")},
                      {'e', QLatin1String("enable_testing")},
                      {'e', QLatin1String("export")},
                      {'f', QLatin1String("fltk_wrap_ui")},
                      {'g', QLatin1String("get_source_file_property")},
                      {'g', QLatin1String("get_target_property")},
                      {'g', QLatin1String("get_test_property")},
                      {'i', QLatin1String("include_directories")},
                      {'i', QLatin1String("include_external_msproject")},
                      {'i', QLatin1String("include_regular_expression")},
                      {'i', QLatin1String("install")},
                      {'l', QLatin1String("link_directories")},
                      {'l', QLatin1String("link_libraries")},
                      {'l', QLatin1String("load_cache")},
                      {'p', QLatin1String("project")},
                      {'q', QLatin1String("qt_wrap_cpp")},
                      {'q', QLatin1String("qt_wrap_ui")},
                      {'r', QLatin1String("remove_definitions")},
                      {'s', QLatin1String("set_source_files_properties")},
                      {'s', QLatin1String("set_target_properties")},
                      {'s', QLatin1String("set_tests_properties")},
                      {'s', QLatin1String("source_group")},
                      {'t', QLatin1String("target_compile_definitions")},
                      {'t', QLatin1String("target_compile_features")},
                      {'t', QLatin1String("target_compile_options")},
                      {'t', QLatin1String("target_include_directories")},
                      {'t', QLatin1String("target_link_directories")},
                      {'t', QLatin1String("target_link_libraries")},
                      {'t', QLatin1String("target_link_options")},
                      {'t', QLatin1String("target_sources")},
                      {'t', QLatin1String("try_compile")},
                      {'t', QLatin1String("try_run")},
                      {'c', QLatin1String("ctest_build")},
                      {'c', QLatin1String("ctest_configure")},
                      {'c', QLatin1String("ctest_coverage")},
                      {'c', QLatin1String("ctest_empty_binary_directory")},
                      {'c', QLatin1String("ctest_memcheck")},
                      {'c', QLatin1String("ctest_read_custom_files")},
                      {'c', QLatin1String("ctest_run_script")},
                      {'c', QLatin1String("ctest_sleep")},
                      {'c', QLatin1String("ctest_start")},
                      {'c', QLatin1String("ctest_submit")},
                      {'c', QLatin1String("ctest_test")},
                      {'c', QLatin1String("ctest_update")},
                      {'c', QLatin1String("ctest_upload")},
                      {'b', QLatin1String("build_name")},
                      {'e', QLatin1String("exec_program")},
                      {'e', QLatin1String("export_library_dependencies")},
                      {'i', QLatin1String("install_files")},
                      {'i', QLatin1String("install_programs")},
                      {'i', QLatin1String("install_targets")},
                      {'l', QLatin1String("load_command")},
                      {'m', QLatin1String("make_directory")},
                      {'o', QLatin1String("output_required_files")},
                      {'r', QLatin1String("remove")},
                      {'s', QLatin1String("subdir_depends")},
                      {'s', QLatin1String("subdirs")},
                      {'u', QLatin1String("use_mangled_mesa")},
                      {'u', QLatin1String("utility_source")},
                      {'v', QLatin1String("variable_requires")},
                      {'w', QLatin1String("write_file")},
                      {'q', QLatin1String("qt5_use_modules")},
                      {'q', QLatin1String("qt5_use_package")},
                      {'q', QLatin1String("qt5_wrap_cpp")},
                      {'a', QLatin1String("and")},
                      {'o', QLatin1String("or")},
                      {'n', QLatin1String("not")},
                      {'c', QLatin1String("command")},
                      {'p', QLatin1String("policy")},
                      {'t', QLatin1String("target")},
                      {'t', QLatin1String("test")},
                      {'e', QLatin1String("exists")},
                      {'i', QLatin1String("is_newer_than")},
                      {'i', QLatin1String("is_directory")},
                      {'i', QLatin1String("is_symlink")},
                      {'i', QLatin1String("is_absolute")},
                      {'m', QLatin1String("matches")},
                      {'l', QLatin1String("less")},
                      {'g', QLatin1String("greater")},
                      {'e', QLatin1String("equal")},
                      {'l', QLatin1String("less_equal")},
                      {'g', QLatin1String("greater_equal")},
                      {'s', QLatin1String("strless")},
                      {'s', QLatin1String("strgreater")},
                      {'s', QLatin1String("strequal")},
                      {'s', QLatin1String("strless_equal")},
                      {'s', QLatin1String("strgreater_equal")},
                      {'v', QLatin1String("version_less")},
                      {'v', QLatin1String("version_greater")},
                      {'v', QLatin1String("version_equal")},
                      {'v', QLatin1String("version_less_equal")},
                      {'v', QLatin1String("version_greater_equal")},
                      {'i', QLatin1String("in_list")},
                      {'d', QLatin1String("defined")}};
    cmake_types = {};
    cmake_literals = {
        {'o', QLatin1String("on")},   {'o', QLatin1String("off")},
        {'O', QLatin1String("ON")},   {'O', QLatin1String("OFF")},
        {'t', QLatin1String("true")}, {'f', QLatin1String("false")},
        {'T', QLatin1String("TRUE")}, {'F', QLatin1String("FALSE")}};
    cmake_builtin = {
        {'A', QLatin1String("ALLOW_DUPLICATE_CUSTOM_TARGETS")},
        {'A', QLatin1String("AUTOGEN_TARGETS_FOLDER")},
        {'A', QLatin1String("AUTOMOC_TARGETS_FOLDER")},
        {'D', QLatin1String("DEBUG_CONFIGURATIONS")},
        {'D', QLatin1String("DISABLED_FEATURES")},
        {'E', QLatin1String("ENABLED_FEATURES")},
        {'E', QLatin1String("ENABLED_LANGUAGES")},
        {'F', QLatin1String("FIND_LIBRARY_USE_LIB64_PATHS")},
        {'F', QLatin1String("FIND_LIBRARY_USE_OPENBSD_VERSIONING")},
        {'G', QLatin1String("GLOBAL_DEPENDS_DEBUG_MODE")},
        {'G', QLatin1String("GLOBAL_DEPENDS_NO_CYCLES")},
        {'I', QLatin1String("IN_TRY_COMPILE")},
        {'P', QLatin1String("PACKAGES_FOUND")},
        {'P', QLatin1String("PACKAGES_NOT_FOUND")},
        {'J', QLatin1String("JOB_POOLS")},
        {'P', QLatin1String("PREDEFINED_TARGETS_FOLDER")},
        {'E', QLatin1String("ECLIPSE_EXTRA_NATURES")},
        {'R', QLatin1String("REPORT_UNDEFINED_PROPERTIES")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'R', QLatin1String("RULE_MESSAGES")},
        {'T', QLatin1String("TARGET_ARCHIVES_MAY_BE_SHARED_LIBS")},
        {'T', QLatin1String("TARGET_SUPPORTS_SHARED_LIBS")},
        {'U', QLatin1String("USE_FOLDERS")},
        {'A', QLatin1String("ADDITIONAL_MAKE_CLEAN_FILES")},
        {'C', QLatin1String("CACHE_VARIABLES")},
        {'C', QLatin1String("CLEAN_NO_CUSTOM")},
        {'C', QLatin1String("CMAKE_CONFIGURE_DEPENDS")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_OPTIONS")},
        {'D', QLatin1String("DEFINITIONS")},
        {'E', QLatin1String("EXCLUDE_FROM_ALL")},
        {'I', QLatin1String("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")},
        {'I', QLatin1String("INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INCLUDE_REGULAR_EXPRESSION")},
        {'I', QLatin1String("INTERPROCEDURAL_OPTIMIZATION")},
        {'L', QLatin1String("LINK_DIRECTORIES")},
        {'L', QLatin1String("LISTFILE_STACK")},
        {'M', QLatin1String("MACROS")},
        {'P', QLatin1String("PARENT_DIRECTORY")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'T', QLatin1String("TEST_INCLUDE_FILE")},
        {'V', QLatin1String("VARIABLES")},
        {'A', QLatin1String("ALIASED_TARGET")},
        {'A', QLatin1String("ARCHIVE_OUTPUT_DIRECTORY")},
        {'A', QLatin1String("ARCHIVE_OUTPUT_NAME")},
        {'A', QLatin1String("AUTOGEN_TARGET_DEPENDS")},
        {'A', QLatin1String("AUTOMOC_MOC_OPTIONS")},
        {'A', QLatin1String("AUTOMOC")},
        {'A', QLatin1String("AUTOUIC")},
        {'A', QLatin1String("AUTOUIC_OPTIONS")},
        {'A', QLatin1String("AUTORCC")},
        {'A', QLatin1String("AUTORCC_OPTIONS")},
        {'B', QLatin1String("BUILD_WITH_INSTALL_RPATH")},
        {'B', QLatin1String("BUNDLE_EXTENSION")},
        {'B', QLatin1String("BUNDLE")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_BOOL")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_NUMBER_MAX")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_NUMBER_MIN")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_STRING")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_FLAGS")},
        {'C', QLatin1String("COMPILE_OPTIONS")},
        {'D', QLatin1String("DEBUG_POSTFIX")},
        {'D', QLatin1String("DEFINE_SYMBOL")},
        {'E', QLatin1String("EchoString")},
        {'E', QLatin1String("ENABLE_EXPORTS")},
        {'E', QLatin1String("EXCLUDE_FROM_ALL")},
        {'E', QLatin1String("EXCLUDE_FROM_DEFAULT_BUILD")},
        {'E', QLatin1String("EXPORT_NAME")},
        {'F', QLatin1String("FOLDER")},
        {'F', QLatin1String("Fortran_FORMAT")},
        {'F', QLatin1String("Fortran_MODULE_DIRECTORY")},
        {'F', QLatin1String("FRAMEWORK")},
        {'G', QLatin1String("GENERATOR_FILE_NAME")},
        {'G', QLatin1String("GNUtoMS")},
        {'H', QLatin1String("HAS_CXX")},
        {'I', QLatin1String("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")},
        {'I', QLatin1String("IMPORTED_CONFIGURATIONS")},
        {'I', QLatin1String("IMPORTED_IMPLIB")},
        {'I', QLatin1String("IMPORTED_LINK_DEPENDENT_LIBRARIES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_LANGUAGES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_LIBRARIES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_MULTIPLICITY")},
        {'I', QLatin1String("IMPORTED_LOCATION")},
        {'I', QLatin1String("IMPORTED_NO_SONAME")},
        {'I', QLatin1String("IMPORTED")},
        {'I', QLatin1String("IMPORTED_SONAME")},
        {'I', QLatin1String("IMPORT_PREFIX")},
        {'I', QLatin1String("IMPORT_SUFFIX")},
        {'I', QLatin1String("INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INSTALL_NAME_DIR")},
        {'I', QLatin1String("INSTALL_RPATH")},
        {'I', QLatin1String("INSTALL_RPATH_USE_LINK_PATH")},
        {'I', QLatin1String("INTERFACE_AUTOUIC_OPTIONS")},
        {'I', QLatin1String("INTERFACE_COMPILE_DEFINITIONS")},
        {'I', QLatin1String("INTERFACE_COMPILE_OPTIONS")},
        {'I', QLatin1String("INTERFACE_INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INTERFACE_LINK_LIBRARIES")},
        {'I', QLatin1String("INTERFACE_POSITION_INDEPENDENT_CODE")},
        {'I', QLatin1String("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INTERPROCEDURAL_OPTIMIZATION")},
        {'J', QLatin1String("JOB_POOL_COMPILE")},
        {'J', QLatin1String("JOB_POOL_LINK")},
        {'L', QLatin1String("LABELS")},
        {'L', QLatin1String("LIBRARY_OUTPUT_DIRECTORY")},
        {'L', QLatin1String("LIBRARY_OUTPUT_NAME")},
        {'L', QLatin1String("LINK_DEPENDS_NO_SHARED")},
        {'L', QLatin1String("LINK_DEPENDS")},
        {'L', QLatin1String("LINKER_LANGUAGE")},
        {'L', QLatin1String("LINK_FLAGS")},
        {'L', QLatin1String("LINK_INTERFACE_LIBRARIES")},
        {'L', QLatin1String("LINK_INTERFACE_MULTIPLICITY")},
        {'L', QLatin1String("LINK_LIBRARIES")},
        {'L', QLatin1String("LINK_SEARCH_END_STATIC")},
        {'L', QLatin1String("LINK_SEARCH_START_STATIC")},
        {'L', QLatin1String("LOCATION")},
        {'M', QLatin1String("MACOSX_BUNDLE_INFO_PLIST")},
        {'M', QLatin1String("MACOSX_BUNDLE")},
        {'M', QLatin1String("MACOSX_FRAMEWORK_INFO_PLIST")},
        {'M', QLatin1String("MACOSX_RPATH")},
        //        {'N', QLatin1String("NAME")},
        {'N', QLatin1String("NO_SONAME")},
        {'N', QLatin1String("NO_SYSTEM_FROM_IMPORTED")},
        {'O', QLatin1String("OSX_ARCHITECTURES")},
        {'O', QLatin1String("OUTPUT_NAME")},
        {'P', QLatin1String("PDB_NAME")},
        {'P', QLatin1String("PDB_OUTPUT_DIRECTORY")},
        {'P', QLatin1String("POSITION_INDEPENDENT_CODE")},
        {'P', QLatin1String("POST_INSTALL_SCRIPT")},
        {'P', QLatin1String("PREFIX")},
        {'P', QLatin1String("PROPERTY")},
        {'P', QLatin1String("PRE_INSTALL_SCRIPT")},
        {'P', QLatin1String("PRIVATE_HEADER")},
        {'P', QLatin1String("PROJECT_LABEL")},
        {'P', QLatin1String("PUBLIC_HEADER")},
        {'R', QLatin1String("RESOURCE")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'R', QLatin1String("RUNTIME_OUTPUT_DIRECTORY")},
        {'R', QLatin1String("RUNTIME_OUTPUT_NAME")},
        {'S', QLatin1String("SKIP_BUILD_RPATH")},
        {'S', QLatin1String("SOURCES")},
        {'S', QLatin1String("SOVERSION")},
        {'S', QLatin1String("STATIC_LIBRARY_FLAGS")},
        {'S', QLatin1String("SUFFIX")},
        {'T', QLatin1String("TARGET")},
        {'T', QLatin1String("TYPE")},
        {'V', QLatin1String("VERSION")},
        {'V', QLatin1String("VISIBILITY_INLINES_HIDDEN")},
        {'V', QLatin1String("VS_DOTNET_REFERENCES")},
        {'V', QLatin1String("VS_DOTNET_TARGET_FRAMEWORK_VERSION")},
        {'V', QLatin1String("VS_GLOBAL_KEYWORD")},
        {'V', QLatin1String("VS_GLOBAL_PROJECT_TYPES")},
        {'V', QLatin1String("VS_GLOBAL_ROOTNAMESPACE")},
        {'V', QLatin1String("VS_KEYWORD")},
        {'V', QLatin1String("VS_SCC_AUXPATH")},
        {'V', QLatin1String("VS_SCC_LOCALPATH")},
        {'V', QLatin1String("VS_SCC_PROJECTNAME")},
        {'V', QLatin1String("VS_SCC_PROVIDER")},
        {'V', QLatin1String("VS_WINRT_EXTENSIONS")},
        {'V', QLatin1String("VS_WINRT_REFERENCES")},
        {'W', QLatin1String("WIN32_EXECUTABLE")},
        {'A', QLatin1String("ATTACHED_FILES_ON_FAIL")},
        {'A', QLatin1String("ATTACHED_FILES")},
        {'C', QLatin1String("COST")},
        {'D', QLatin1String("DEPENDS")},
        {'E', QLatin1String("ENVIRONMENT")},
        {'F', QLatin1String("FAIL_REGULAR_EXPRESSION")},
        {'L', QLatin1String("LABELS")},
        {'M', QLatin1String("MEASUREMENT")},
        {'P', QLatin1String("PASS_REGULAR_EXPRESSION")},
        {'P', QLatin1String("PROCESSORS")},
        {'R', QLatin1String("REQUIRED_FILES")},
        {'R', QLatin1String("RESOURCE_LOCK")},
        {'R', QLatin1String("RUN_SERIAL")},
        {'S', QLatin1String("SKIP_RETURN_CODE")},
        {'T', QLatin1String("TIMEOUT")},
        {'W', QLatin1String("WILL_FAIL")},
        {'W', QLatin1String("WORKING_DIRECTORY")},
        {'A', QLatin1String("ABSTRACT")},
        {'A', QLatin1String("AUTOUIC_OPTIONS")},
        {'A', QLatin1String("AUTORCC_OPTIONS")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_FLAGS")},
        {'E', QLatin1String("EXTERNAL_OBJECT")},
        {'F', QLatin1String("Fortran_FORMAT")},
        {'G', QLatin1String("GENERATED")},
        {'H', QLatin1String("HEADER_FILE_ONLY")},
        {'K', QLatin1String("KEEP_EXTENSION")},
        {'L', QLatin1String("LABELS")},
        //        {'L', QLatin1String("LANGUAGE")},
        {'L', QLatin1String("LOCATION")},
        {'M', QLatin1String("MACOSX_PACKAGE_LOCATION")},
        {'O', QLatin1String("OBJECT_DEPENDS")},
        {'O', QLatin1String("OBJECT_OUTPUTS")},
        {'S', QLatin1String("SYMBOLIC")},
        {'W', QLatin1String("WRAP_EXCLUDE")},
        {'A', QLatin1String("ADVANCED")},
        {'H', QLatin1String("HELPSTRING")},
        {'M', QLatin1String("MODIFIED")},
        {'S', QLatin1String("STRINGS")},
        {'T', QLatin1String("TYPE")},
        {'V', QLatin1String("VALUE")}};
    cmake_other = {
        {'C', QLatin1String("CMAKE_ARGC")},
        {'C', QLatin1String("CMAKE_ARGV0")},
        {'C', QLatin1String("CMAKE_AR")},
        {'C', QLatin1String("CMAKE_BINARY_DIR")},
        {'C', QLatin1String("CMAKE_BUILD_TOOL")},
        {'C', QLatin1String("CMAKE_CACHEFILE_DIR")},
        {'C', QLatin1String("CMAKE_CACHE_MAJOR_VERSION")},
        {'C', QLatin1String("CMAKE_CACHE_MINOR_VERSION")},
        {'C', QLatin1String("CMAKE_CACHE_PATCH_VERSION")},
        {'C', QLatin1String("CMAKE_CFG_INTDIR")},
        {'C', QLatin1String("CMAKE_COMMAND")},
        {'C', QLatin1String("CMAKE_CROSSCOMPILING")},
        {'C', QLatin1String("CMAKE_CTEST_COMMAND")},
        {'C', QLatin1String("CMAKE_CURRENT_BINARY_DIR")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_DIR")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_FILE")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_LINE")},
        {'C', QLatin1String("CMAKE_CURRENT_SOURCE_DIR")},
        {'C', QLatin1String("CMAKE_DL_LIBS")},
        {'C', QLatin1String("CMAKE_EDIT_COMMAND")},
        {'C', QLatin1String("CMAKE_EXECUTABLE_SUFFIX")},
        {'C', QLatin1String("CMAKE_EXTRA_GENERATOR")},
        {'C', QLatin1String("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")},
        {'C', QLatin1String("CMAKE_GENERATOR")},
        {'C', QLatin1String("CMAKE_GENERATOR_TOOLSET")},
        {'C', QLatin1String("CMAKE_HOME_DIRECTORY")},
        {'C', QLatin1String("CMAKE_IMPORT_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_IMPORT_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_JOB_POOL_COMPILE")},
        {'C', QLatin1String("CMAKE_JOB_POOL_LINK")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_MAJOR_VERSION")},
        {'C', QLatin1String("CMAKE_MAKE_PROGRAM")},
        {'C', QLatin1String("CMAKE_MINIMUM_REQUIRED_VERSION")},
        {'C', QLatin1String("CMAKE_MINOR_VERSION")},
        {'C', QLatin1String("CMAKE_PARENT_LIST_FILE")},
        {'C', QLatin1String("CMAKE_PATCH_VERSION")},
        {'C', QLatin1String("CMAKE_PROJECT_NAME")},
        {'C', QLatin1String("CMAKE_RANLIB")},
        {'C', QLatin1String("CMAKE_ROOT")},
        {'C', QLatin1String("CMAKE_SCRIPT_MODE_FILE")},
        {'C', QLatin1String("CMAKE_SHARED_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_SHARED_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_SHARED_MODULE_PREFIX")},
        {'C', QLatin1String("CMAKE_SHARED_MODULE_SUFFIX")},
        {'C', QLatin1String("CMAKE_SIZEOF_VOID_P")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_RULES")},
        {'C', QLatin1String("CMAKE_SKIP_RPATH")},
        {'C', QLatin1String("CMAKE_SOURCE_DIR")},
        {'C', QLatin1String("CMAKE_STANDARD_LIBRARIES")},
        {'C', QLatin1String("CMAKE_STATIC_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_STATIC_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_TOOLCHAIN_FILE")},
        {'C', QLatin1String("CMAKE_TWEAK_VERSION")},
        {'C', QLatin1String("CMAKE_VERBOSE_MAKEFILE")},
        {'C', QLatin1String("CMAKE_VERSION")},
        {'C', QLatin1String("CMAKE_VS_DEVENV_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_INTEL_Fortran_PROJECT_VERSION")},
        {'C', QLatin1String("CMAKE_VS_MSBUILD_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_MSDEV_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_PLATFORM_TOOLSET")},
        {'C', QLatin1String("CMAKE_XCODE_PLATFORM_TOOLSET")},
        {'P', QLatin1String("PROJECT_BINARY_DIR")},
        //        {'P', QLatin1String("PROJECT_NAME")},
        {'P', QLatin1String("PROJECT_SOURCE_DIR")},
        {'P', QLatin1String("PROJECT_VERSION")},
        {'P', QLatin1String("PROJECT_VERSION_MAJOR")},
        {'P', QLatin1String("PROJECT_VERSION_MINOR")},
        {'P', QLatin1String("PROJECT_VERSION_PATCH")},
        {'P', QLatin1String("PROJECT_VERSION_TWEAK")},
        {'B', QLatin1String("BUILD_SHARED_LIBS")},
        {'C', QLatin1String("CMAKE_ABSOLUTE_DESTINATION_FILES")},
        {'C', QLatin1String("CMAKE_APPBUNDLE_PATH")},
        {'C', QLatin1String("CMAKE_AUTOMOC_RELAXED_MODE")},
        {'C', QLatin1String("CMAKE_BACKWARDS_COMPATIBILITY")},
        {'C', QLatin1String("CMAKE_BUILD_TYPE")},
        {'C', QLatin1String("CMAKE_COLOR_MAKEFILE")},
        {'C', QLatin1String("CMAKE_CONFIGURATION_TYPES")},
        {'C', QLatin1String("CMAKE_DEBUG_TARGET_PROPERTIES")},
        {'C', QLatin1String("CMAKE_ERROR_DEPRECATED")},
        {'C', QLatin1String("CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'C', QLatin1String("CMAKE_SYSROOT")},
        {'C', QLatin1String("CMAKE_FIND_LIBRARY_PREFIXES")},
        {'C', QLatin1String("CMAKE_FIND_LIBRARY_SUFFIXES")},
        {'C', QLatin1String("CMAKE_FIND_NO_INSTALL_PREFIX")},
        {'C', QLatin1String("CMAKE_FIND_PACKAGE_WARN_NO_MODULE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_INCLUDE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_LIBRARY")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_PACKAGE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_PROGRAM")},
        {'C', QLatin1String("CMAKE_FRAMEWORK_PATH")},
        {'C', QLatin1String("CMAKE_IGNORE_PATH")},
        {'C', QLatin1String("CMAKE_INCLUDE_PATH")},
        {'C', QLatin1String("CMAKE_INCLUDE_DIRECTORIES_BEFORE")},
        {'C', QLatin1String("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE")},
        {'C', QLatin1String("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME")},
        {'C', QLatin1String("CMAKE_INSTALL_PREFIX")},
        {'C', QLatin1String("CMAKE_LIBRARY_PATH")},
        {'C', QLatin1String("CMAKE_MFC_FLAG")},
        {'C', QLatin1String("CMAKE_MODULE_PATH")},
        {'C', QLatin1String("CMAKE_NOT_USING_CONFIG_FLAGS")},
        {'C', QLatin1String("CMAKE_PREFIX_PATH")},
        {'C', QLatin1String("CMAKE_PROGRAM_PATH")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY")},
        {'C', QLatin1String("CMAKE_STAGING_PREFIX")},
        {'C', QLatin1String("CMAKE_SYSTEM_IGNORE_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_INCLUDE_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_LIBRARY_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_PREFIX_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_PROGRAM_PATH")},
        {'C', QLatin1String("CMAKE_USER_MAKE_RULES_OVERRIDE")},
        {'C', QLatin1String("CMAKE_WARN_DEPRECATED")},
        {'C', QLatin1String("CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'A', QLatin1String("APPLE")},
        {'B', QLatin1String("BORLAND")},
        {'C', QLatin1String("CMAKE_CL_64")},
        {'C', QLatin1String("CMAKE_COMPILER_2005")},
        {'C', QLatin1String("CMAKE_HOST_APPLE")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_NAME")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_PROCESSOR")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_VERSION")},
        {'C', QLatin1String("CMAKE_HOST_UNIX")},
        {'C', QLatin1String("CMAKE_HOST_WIN32")},
        {'C', QLatin1String("CMAKE_LIBRARY_ARCHITECTURE_REGEX")},
        {'C', QLatin1String("CMAKE_LIBRARY_ARCHITECTURE")},
        {'C', QLatin1String("CMAKE_OBJECT_PATH_MAX")},
        {'C', QLatin1String("CMAKE_SYSTEM_NAME")},
        {'C', QLatin1String("CMAKE_SYSTEM_PROCESSOR")},
        {'C', QLatin1String("CMAKE_SYSTEM")},
        {'C', QLatin1String("CMAKE_SYSTEM_VERSION")},
        {'C', QLatin1String("CYGWIN")},
        {'E', QLatin1String("ENV")},
        {'M', QLatin1String("MSVC10")},
        {'M', QLatin1String("MSVC11")},
        {'M', QLatin1String("MSVC12")},
        {'M', QLatin1String("MSVC60")},
        {'M', QLatin1String("MSVC70")},
        {'M', QLatin1String("MSVC71")},
        {'M', QLatin1String("MSVC80")},
        {'M', QLatin1String("MSVC90")},
        {'M', QLatin1String("MSVC_IDE")},
        {'M', QLatin1String("MSVC")},
        {'M', QLatin1String("MSVC_VERSION")},
        {'U', QLatin1String("UNIX")},
        {'W', QLatin1String("WIN32")},
        {'X', QLatin1String("XCODE_VERSION")},
        {'C', QLatin1String("CMAKE_ARCHIVE_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_AUTOMOC_MOC_OPTIONS")},
        {'C', QLatin1String("CMAKE_AUTOMOC")},
        {'C', QLatin1String("CMAKE_AUTORCC")},
        {'C', QLatin1String("CMAKE_AUTORCC_OPTIONS")},
        {'C', QLatin1String("CMAKE_AUTOUIC")},
        {'C', QLatin1String("CMAKE_AUTOUIC_OPTIONS")},
        {'C', QLatin1String("CMAKE_BUILD_WITH_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_DEBUG_POSTFIX")},
        {'C', QLatin1String("CMAKE_EXE_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_Fortran_FORMAT")},
        {'C', QLatin1String("CMAKE_Fortran_MODULE_DIRECTORY")},
        {'C', QLatin1String("CMAKE_GNUtoMS")},
        {'C', QLatin1String("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")},
        {'C', QLatin1String("CMAKE_INCLUDE_CURRENT_DIR")},
        {'C', QLatin1String("CMAKE_INSTALL_NAME_DIR")},
        {'C', QLatin1String("CMAKE_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_INSTALL_RPATH_USE_LINK_PATH")},
        {'C', QLatin1String("CMAKE_LIBRARY_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_LIBRARY_PATH_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_DEF_FILE_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_DEPENDS_NO_SHARED")},
        {'C', QLatin1String("CMAKE_LINK_INTERFACE_LIBRARIES")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_FILE_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_FLAG")},
        {'C', QLatin1String("CMAKE_MACOSX_BUNDLE")},
        {'C', QLatin1String("CMAKE_MACOSX_RPATH")},
        {'C', QLatin1String("CMAKE_MODULE_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_NO_BUILTIN_CHRPATH")},
        {'C', QLatin1String("CMAKE_NO_SYSTEM_FROM_IMPORTED")},
        {'C', QLatin1String("CMAKE_OSX_ARCHITECTURES")},
        {'C', QLatin1String("CMAKE_OSX_DEPLOYMENT_TARGET")},
        {'C', QLatin1String("CMAKE_OSX_SYSROOT")},
        {'C', QLatin1String("CMAKE_PDB_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_POSITION_INDEPENDENT_CODE")},
        {'C', QLatin1String("CMAKE_RUNTIME_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_SHARED_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_SKIP_BUILD_RPATH")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_STATIC_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_TRY_COMPILE_CONFIGURATION")},
        {'C', QLatin1String("CMAKE_USE_RELATIVE_PATHS")},
        {'C', QLatin1String("CMAKE_VISIBILITY_INLINES_HIDDEN")},
        {'C', QLatin1String("CMAKE_WIN32_EXECUTABLE")},
        {'E', QLatin1String("EXECUTABLE_OUTPUT_PATH")},
        {'L', QLatin1String("LIBRARY_OUTPUT_PATH")},
        {'C', QLatin1String("CMAKE_Fortran_MODDIR_DEFAULT")},
        {'C', QLatin1String("CMAKE_Fortran_MODDIR_FLAG")},
        {'C', QLatin1String("CMAKE_Fortran_MODOUT_FLAG")},
        {'C', QLatin1String("CMAKE_INTERNAL_PLATFORM_ABI")},
        {'C', QLatin1String("CPACK_ABSOLUTE_DESTINATION_FILES")},
        {'C', QLatin1String("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")},
        {'C', QLatin1String("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'C', QLatin1String("CPACK_INCLUDE_TOPLEVEL_DIRECTORY")},
        {'C', QLatin1String("CPACK_INSTALL_SCRIPT")},
        {'C', QLatin1String("CPACK_PACKAGING_INSTALL_PREFIX")},
        {'C', QLatin1String("CPACK_SET_DESTDIR")},
        {'C', QLatin1String("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")}};
}